

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::sse2::CurveNiMBIntersectorK<4,4>::
     intersect_h<embree::sse2::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,4>,embree::sse2::Intersect1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  _func_int ***ppp_Var5;
  float *pfVar6;
  _func_int ***ppp_Var7;
  undefined1 (*pauVar8) [12];
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  Primitive PVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  Geometry *pGVar27;
  __int_type_conflict _Var28;
  long lVar29;
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  unkbyte9 Var62;
  undefined1 auVar63 [13];
  undefined1 auVar64 [12];
  undefined1 auVar65 [13];
  undefined1 auVar66 [12];
  undefined1 auVar67 [13];
  undefined1 auVar68 [12];
  undefined1 auVar69 [13];
  undefined1 auVar70 [12];
  undefined1 auVar71 [12];
  undefined6 uVar72;
  undefined1 auVar73 [12];
  undefined1 auVar74 [12];
  undefined1 auVar75 [12];
  undefined1 auVar76 [12];
  undefined1 auVar77 [12];
  undefined1 auVar78 [12];
  undefined1 auVar79 [12];
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  undefined1 auVar82 [12];
  undefined1 auVar83 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [12];
  undefined1 auVar86 [15];
  bool bVar87;
  bool bVar88;
  bool bVar89;
  bool bVar90;
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [13];
  undefined1 auVar98 [15];
  undefined1 auVar99 [16];
  undefined4 uVar100;
  ulong uVar101;
  long lVar102;
  RTCFilterFunctionN p_Var103;
  RTCRayN *pRVar104;
  RTCIntersectArguments *pRVar105;
  long lVar107;
  RTCIntersectArguments *pRVar108;
  Geometry *pGVar109;
  long lVar110;
  long lVar111;
  long lVar112;
  uint uVar113;
  uint uVar114;
  uint uVar115;
  uint uVar116;
  uint uVar117;
  uint uVar118;
  uint uVar119;
  short sVar120;
  int iVar121;
  float fVar122;
  int iVar181;
  undefined1 auVar123 [12];
  undefined1 auVar128 [16];
  char cVar185;
  undefined1 auVar131 [16];
  undefined1 auVar125 [12];
  undefined1 auVar135 [16];
  undefined1 auVar126 [12];
  undefined1 auVar139 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar127 [12];
  undefined1 auVar149 [16];
  undefined1 auVar153 [16];
  undefined1 auVar156 [16];
  undefined1 auVar159 [16];
  undefined1 auVar162 [16];
  undefined1 auVar165 [16];
  undefined1 auVar168 [16];
  float fVar184;
  float fVar186;
  undefined8 uVar187;
  float fVar188;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar171;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar172;
  undefined1 auVar173 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar174;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar175;
  undefined1 auVar176 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar177;
  undefined1 auVar178 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar179;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar218;
  float fVar220;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar219;
  float fVar221;
  float fVar222;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  char cVar223;
  float fVar224;
  char cVar239;
  float fVar240;
  float fVar242;
  vfloat4 v;
  float fVar225;
  undefined1 auVar228 [16];
  float fVar241;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar243;
  char cVar261;
  float fVar262;
  float fVar264;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar244;
  undefined1 auVar251 [16];
  float fVar263;
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar268;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar269;
  float fVar278;
  float fVar279;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  float fVar280;
  float fVar291;
  float fVar292;
  undefined1 auVar281 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  float fVar293;
  float fVar294;
  float fVar302;
  float fVar305;
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar299 [16];
  float fVar303;
  float fVar304;
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  float fVar310;
  float fVar311;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  undefined1 auVar312 [16];
  float fVar320;
  undefined1 uVar325;
  float fVar326;
  float fVar327;
  undefined1 auVar321 [16];
  undefined1 auVar324 [16];
  float fVar328;
  float fVar334;
  float fVar335;
  undefined1 auVar329 [16];
  float fVar336;
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  float fVar337;
  float fVar346;
  float fVar348;
  undefined1 auVar338 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar341;
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  float fVar347;
  float fVar349;
  float fVar350;
  float fVar351;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar345;
  float fVar352;
  float fVar360;
  float fVar362;
  undefined1 auVar353 [16];
  undefined1 auVar356 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar357;
  float fVar361;
  float fVar363;
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar371;
  float fVar372;
  float fVar374;
  float fVar375;
  float fVar377;
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  float fVar373;
  float fVar376;
  float fVar378;
  undefined1 auVar370 [16];
  float fVar379;
  float fVar389;
  float fVar390;
  undefined1 auVar380 [16];
  float fVar391;
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  float fVar395;
  float fVar396;
  float fVar397;
  float fVar398;
  float fVar403;
  float fVar406;
  float fVar407;
  float fVar408;
  float fVar411;
  undefined1 auVar399 [16];
  float fVar404;
  float fVar405;
  float fVar409;
  float fVar410;
  float fVar412;
  float fVar413;
  undefined1 auVar402 [16];
  float fVar414;
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 local_518 [6];
  undefined2 uStack_512;
  float fStack_510;
  undefined4 uStack_50c;
  undefined2 local_4d8;
  undefined2 uStack_4d6;
  undefined2 uStack_4d4;
  undefined2 uStack_4d2;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined4 uStack_48c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_478;
  vbool<4> valid;
  undefined1 local_428 [16];
  RTCIntersectArguments *local_410;
  undefined8 local_408;
  undefined8 uStack_400;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  RTCFilterFunctionNArguments args;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float local_358;
  float fStack_354;
  float fStack_350;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_4> bhit;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ulong uVar106;
  undefined1 auVar124 [12];
  undefined1 auVar146 [16];
  undefined1 auVar150 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar129 [16];
  undefined1 auVar132 [16];
  undefined1 auVar136 [16];
  undefined1 auVar140 [16];
  undefined1 auVar147 [16];
  undefined1 auVar151 [16];
  undefined1 auVar130 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar141 [16];
  undefined1 auVar148 [16];
  undefined1 auVar152 [16];
  undefined2 uVar180;
  int iVar182;
  int iVar183;
  undefined1 auVar226 [12];
  undefined1 auVar229 [16];
  undefined1 auVar227 [16];
  undefined1 auVar230 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  
  PVar19 = prim[1];
  uVar101 = (ulong)(byte)PVar19;
  lVar107 = uVar101 * 0x25;
  uVar100 = *(undefined4 *)(prim + uVar101 * 4 + 6);
  uVar20 = *(undefined4 *)(prim + uVar101 * 5 + 6);
  uVar21 = *(undefined4 *)(prim + uVar101 * 6 + 6);
  uVar22 = *(undefined4 *)(prim + uVar101 * 0xf + 6);
  uVar23 = *(undefined4 *)(prim + (ulong)(byte)PVar19 * 0x10 + 6);
  uVar24 = *(undefined4 *)(prim + uVar101 * 0x11 + 6);
  uVar25 = *(undefined4 *)(prim + uVar101 * 0x1a + 6);
  uVar26 = *(undefined4 *)(prim + uVar101 * 0x1b + 6);
  auVar144 = *(undefined1 (*) [16])(prim + lVar107 + 6);
  auVar246._12_4_ = auVar144._12_4_;
  fVar189 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar107 + 0x16)) *
            *(float *)(prim + lVar107 + 0x1a);
  auVar123._0_8_ = CONCAT44(auVar246._12_4_,auVar246._12_4_);
  auVar123._8_4_ = auVar246._12_4_;
  auVar246._0_12_ = auVar123;
  fVar280 = (*(float *)(ray + k * 4) - auVar144._0_4_) * auVar246._12_4_;
  fVar291 = (*(float *)(ray + k * 4 + 0x10) - auVar144._4_4_) * auVar246._12_4_;
  fVar292 = (*(float *)(ray + k * 4 + 0x20) - auVar144._8_4_) * auVar246._12_4_;
  fVar364 = *(float *)(ray + k * 4 + 0x40) * auVar246._12_4_;
  fVar371 = *(float *)(ray + k * 4 + 0x50) * auVar246._12_4_;
  fVar374 = *(float *)(ray + k * 4 + 0x60) * auVar246._12_4_;
  auVar30[0xd] = 0;
  auVar30._0_13_ = auVar246._0_13_;
  auVar30[0xe] = auVar144[0xf];
  auVar34[0xc] = auVar144[0xe];
  auVar34._0_12_ = auVar123;
  auVar34._13_2_ = auVar30._13_2_;
  auVar38[0xb] = 0;
  auVar38._0_11_ = auVar123._0_11_;
  auVar38._12_3_ = auVar34._12_3_;
  auVar42[10] = auVar144[0xd];
  auVar42._0_10_ = auVar123._0_10_;
  auVar42._11_4_ = auVar38._11_4_;
  auVar46[9] = 0;
  auVar46._0_9_ = auVar123._0_9_;
  auVar46._10_5_ = auVar42._10_5_;
  auVar50[8] = auVar144[0xc];
  auVar50._0_8_ = auVar123._0_8_;
  auVar50._9_6_ = auVar46._9_6_;
  Var62 = CONCAT81(CONCAT71(auVar50._8_7_,(char)((uint)uVar20 >> 0x18)),auVar144[0xf]);
  auVar54._6_9_ = Var62;
  auVar54[5] = (char)((uint)uVar20 >> 0x10);
  auVar54[4] = auVar144[0xe];
  auVar54._0_4_ = auVar246._12_4_;
  cVar239 = (char)((uint)uVar20 >> 8);
  auVar63._2_11_ = auVar54._4_11_;
  auVar63[1] = cVar239;
  auVar63[0] = auVar144[0xd];
  cVar223 = (char)uVar20;
  sVar120 = CONCAT11(cVar223,auVar144[0xc]);
  auVar58._2_13_ = auVar63;
  auVar58._0_2_ = sVar120;
  uVar180 = (undefined2)Var62;
  auVar144._0_12_ = auVar58._0_12_;
  auVar144._12_2_ = uVar180;
  auVar144._14_2_ = uVar180;
  auVar129._12_4_ = auVar144._12_4_;
  auVar129._0_10_ = auVar58._0_10_;
  auVar129._10_2_ = auVar54._4_2_;
  auVar128._10_6_ = auVar129._10_6_;
  auVar128._0_8_ = auVar58._0_8_;
  auVar128._8_2_ = auVar54._4_2_;
  auVar64._4_8_ = auVar128._8_8_;
  auVar64._2_2_ = auVar63._0_2_;
  auVar64._0_2_ = auVar63._0_2_;
  iVar121 = (int)sVar120 >> 8;
  iVar181 = auVar64._0_4_ >> 0x18;
  auVar124._0_8_ = CONCAT44(iVar181,iVar121);
  auVar124._8_4_ = auVar128._8_4_ >> 0x18;
  auVar130._12_4_ = auVar129._12_4_ >> 0x18;
  auVar130._0_12_ = auVar124;
  fVar346 = (float)iVar181;
  cVar185 = cVar239 >> 7;
  auVar31[0xd] = 0;
  auVar31._0_13_ = auVar130._0_13_;
  auVar31[0xe] = cVar185;
  auVar35[0xc] = cVar185;
  auVar35._0_12_ = auVar124;
  auVar35._13_2_ = auVar31._13_2_;
  auVar39[0xb] = 0;
  auVar39._0_11_ = auVar124._0_11_;
  auVar39._12_3_ = auVar35._12_3_;
  auVar43[10] = cVar185;
  auVar43._0_10_ = auVar124._0_10_;
  auVar43._11_4_ = auVar39._11_4_;
  auVar47[9] = 0;
  auVar47._0_9_ = auVar124._0_9_;
  auVar47._10_5_ = auVar43._10_5_;
  auVar51[8] = cVar239;
  auVar51._0_8_ = auVar124._0_8_;
  auVar51._9_6_ = auVar47._9_6_;
  Var62 = CONCAT81(CONCAT71(auVar51._8_7_,(char)((uint)uVar21 >> 0x18)),(short)cVar223 >> 7);
  auVar55._6_9_ = Var62;
  auVar55[5] = (char)((uint)uVar21 >> 0x10);
  auVar55[4] = (undefined1)((short)cVar223 >> 7);
  auVar55._0_4_ = iVar121;
  cVar261 = (char)((uint)uVar21 >> 8);
  auVar65._2_11_ = auVar55._4_11_;
  auVar65[1] = cVar261;
  auVar65[0] = (undefined1)((short)cVar223 >> 7);
  cVar239 = (char)uVar21;
  auVar59._2_13_ = auVar65;
  auVar59._0_2_ = CONCAT11(cVar239,cVar223);
  uVar180 = (undefined2)Var62;
  auVar133._0_12_ = auVar59._0_12_;
  auVar133._12_2_ = uVar180;
  auVar133._14_2_ = uVar180;
  auVar132._12_4_ = auVar133._12_4_;
  auVar132._0_10_ = auVar59._0_10_;
  auVar132._10_2_ = auVar55._4_2_;
  auVar131._10_6_ = auVar132._10_6_;
  auVar131._0_8_ = auVar59._0_8_;
  auVar131._8_2_ = auVar55._4_2_;
  auVar66._4_8_ = auVar131._8_8_;
  auVar66._2_2_ = auVar65._0_2_;
  auVar66._0_2_ = auVar65._0_2_;
  iVar181 = (int)CONCAT11(cVar239,cVar223) >> 8;
  iVar182 = auVar66._0_4_ >> 0x18;
  auVar125._0_8_ = CONCAT44(iVar182,iVar181);
  auVar125._8_4_ = auVar131._8_4_ >> 0x18;
  auVar134._12_4_ = auVar132._12_4_ >> 0x18;
  auVar134._0_12_ = auVar125;
  fVar360 = (float)iVar182;
  cVar185 = cVar261 >> 7;
  auVar32[0xd] = 0;
  auVar32._0_13_ = auVar134._0_13_;
  auVar32[0xe] = cVar185;
  auVar36[0xc] = cVar185;
  auVar36._0_12_ = auVar125;
  auVar36._13_2_ = auVar32._13_2_;
  auVar40[0xb] = 0;
  auVar40._0_11_ = auVar125._0_11_;
  auVar40._12_3_ = auVar36._12_3_;
  auVar44[10] = cVar185;
  auVar44._0_10_ = auVar125._0_10_;
  auVar44._11_4_ = auVar40._11_4_;
  auVar48[9] = 0;
  auVar48._0_9_ = auVar125._0_9_;
  auVar48._10_5_ = auVar44._10_5_;
  auVar52[8] = cVar261;
  auVar52._0_8_ = auVar125._0_8_;
  auVar52._9_6_ = auVar48._9_6_;
  Var62 = CONCAT81(CONCAT71(auVar52._8_7_,(char)((uint)uVar23 >> 0x18)),(short)cVar239 >> 7);
  auVar56._6_9_ = Var62;
  auVar56[5] = (char)((uint)uVar23 >> 0x10);
  auVar56[4] = (undefined1)((short)cVar239 >> 7);
  auVar56._0_4_ = iVar181;
  cVar261 = (char)((uint)uVar23 >> 8);
  auVar67._2_11_ = auVar56._4_11_;
  auVar67[1] = cVar261;
  auVar67[0] = (undefined1)((short)cVar239 >> 7);
  cVar223 = (char)uVar23;
  auVar60._2_13_ = auVar67;
  auVar60._0_2_ = CONCAT11(cVar223,cVar239);
  uVar180 = (undefined2)Var62;
  auVar137._0_12_ = auVar60._0_12_;
  auVar137._12_2_ = uVar180;
  auVar137._14_2_ = uVar180;
  auVar136._12_4_ = auVar137._12_4_;
  auVar136._0_10_ = auVar60._0_10_;
  auVar136._10_2_ = auVar56._4_2_;
  auVar135._10_6_ = auVar136._10_6_;
  auVar135._0_8_ = auVar60._0_8_;
  auVar135._8_2_ = auVar56._4_2_;
  auVar68._4_8_ = auVar135._8_8_;
  auVar68._2_2_ = auVar67._0_2_;
  auVar68._0_2_ = auVar67._0_2_;
  iVar182 = (int)CONCAT11(cVar223,cVar239) >> 8;
  iVar183 = auVar68._0_4_ >> 0x18;
  auVar126._0_8_ = CONCAT44(iVar183,iVar182);
  auVar126._8_4_ = auVar135._8_4_ >> 0x18;
  auVar138._12_4_ = auVar136._12_4_ >> 0x18;
  auVar138._0_12_ = auVar126;
  fVar313 = (float)iVar183;
  cVar185 = cVar261 >> 7;
  auVar33[0xd] = 0;
  auVar33._0_13_ = auVar138._0_13_;
  auVar33[0xe] = cVar185;
  auVar37[0xc] = cVar185;
  auVar37._0_12_ = auVar126;
  auVar37._13_2_ = auVar33._13_2_;
  auVar41[0xb] = 0;
  auVar41._0_11_ = auVar126._0_11_;
  auVar41._12_3_ = auVar37._12_3_;
  auVar45[10] = cVar185;
  auVar45._0_10_ = auVar126._0_10_;
  auVar45._11_4_ = auVar41._11_4_;
  auVar49[9] = 0;
  auVar49._0_9_ = auVar126._0_9_;
  auVar49._10_5_ = auVar45._10_5_;
  auVar53[8] = cVar261;
  auVar53._0_8_ = auVar126._0_8_;
  auVar53._9_6_ = auVar49._9_6_;
  Var62 = CONCAT81(CONCAT71(auVar53._8_7_,(char)((uint)uVar24 >> 0x18)),(short)cVar223 >> 7);
  auVar57._6_9_ = Var62;
  auVar57[5] = (char)((uint)uVar24 >> 0x10);
  auVar57[4] = (undefined1)((short)cVar223 >> 7);
  auVar57._0_4_ = iVar182;
  auVar69._2_11_ = auVar57._4_11_;
  auVar69[1] = (char)((uint)uVar24 >> 8);
  auVar69[0] = (undefined1)((short)cVar223 >> 7);
  sVar120 = CONCAT11((char)uVar24,cVar223);
  auVar61._2_13_ = auVar69;
  auVar61._0_2_ = sVar120;
  uVar180 = (undefined2)Var62;
  auVar141._0_12_ = auVar61._0_12_;
  auVar141._12_2_ = uVar180;
  auVar141._14_2_ = uVar180;
  auVar140._12_4_ = auVar141._12_4_;
  auVar140._0_10_ = auVar61._0_10_;
  auVar140._10_2_ = auVar57._4_2_;
  auVar139._10_6_ = auVar140._10_6_;
  auVar139._0_8_ = auVar61._0_8_;
  auVar139._8_2_ = auVar57._4_2_;
  auVar70._4_8_ = auVar139._8_8_;
  auVar70._2_2_ = auVar69._0_2_;
  auVar70._0_2_ = auVar69._0_2_;
  fVar190 = (float)((int)sVar120 >> 8);
  fVar218 = (float)(auVar70._0_4_ >> 0x18);
  fVar220 = (float)(auVar139._8_4_ >> 0x18);
  fVar224 = fVar374 * fVar190;
  fVar240 = fVar374 * fVar218;
  auVar226._0_8_ = CONCAT44(fVar240,fVar224);
  auVar226._8_4_ = fVar374 * fVar220;
  auVar227._12_4_ = fVar374 * (float)(auVar140._12_4_ >> 0x18);
  auVar227._0_12_ = auVar226;
  uVar20 = *(undefined4 *)(prim + uVar101 * 0x1c + 6);
  local_4d8._0_1_ = (undefined1)uVar100;
  local_4d8._1_1_ = (undefined1)((uint)uVar100 >> 8);
  uStack_4d6._0_1_ = (undefined1)((uint)uVar100 >> 0x10);
  uStack_4d6._1_1_ = (undefined1)((uint)uVar100 >> 0x18);
  auVar86[0xd] = 0;
  auVar86._0_13_ = auVar227._0_13_;
  auVar86[0xe] = (char)((uint)fVar240 >> 0x18);
  auVar91[0xc] = (char)((uint)fVar240 >> 0x10);
  auVar91._0_12_ = auVar226;
  auVar91._13_2_ = auVar86._13_2_;
  auVar92[0xb] = 0;
  auVar92._0_11_ = auVar226._0_11_;
  auVar92._12_3_ = auVar91._12_3_;
  auVar93[10] = (char)((uint)fVar240 >> 8);
  auVar93._0_10_ = auVar226._0_10_;
  auVar93._11_4_ = auVar92._11_4_;
  auVar94[9] = 0;
  auVar94._0_9_ = auVar226._0_9_;
  auVar94._10_5_ = auVar93._10_5_;
  auVar95[8] = SUB41(fVar240,0);
  auVar95._0_8_ = auVar226._0_8_;
  auVar95._9_6_ = auVar94._9_6_;
  Var62 = CONCAT81(CONCAT71(auVar95._8_7_,uStack_4d6._1_1_),(char)((uint)fVar224 >> 0x18));
  auVar96._6_9_ = Var62;
  auVar96[5] = (undefined1)uStack_4d6;
  auVar96[4] = (char)((uint)fVar224 >> 0x10);
  auVar96._0_4_ = fVar224;
  auVar97._2_11_ = auVar96._4_11_;
  auVar97[1] = local_4d8._1_1_;
  auVar97[0] = (char)((uint)fVar224 >> 8);
  sVar120 = CONCAT11((undefined1)local_4d8,SUB41(fVar224,0));
  auVar98._2_13_ = auVar97;
  auVar98._0_2_ = sVar120;
  uVar180 = (undefined2)Var62;
  auVar230._0_12_ = auVar98._0_12_;
  auVar230._12_2_ = uVar180;
  auVar230._14_2_ = uVar180;
  auVar229._12_4_ = auVar230._12_4_;
  auVar229._0_10_ = auVar98._0_10_;
  auVar229._10_2_ = auVar96._4_2_;
  auVar228._10_6_ = auVar229._10_6_;
  auVar228._0_8_ = auVar98._0_8_;
  auVar228._8_2_ = auVar96._4_2_;
  auVar71._4_8_ = auVar228._8_8_;
  auVar71._2_2_ = auVar97._0_2_;
  auVar71._0_2_ = auVar97._0_2_;
  fVar293 = (float)((int)sVar120 >> 8);
  fVar302 = (float)(auVar71._0_4_ >> 0x18);
  fVar305 = (float)(auVar228._8_4_ >> 0x18);
  uVar325 = (undefined1)((uint)uVar22 >> 0x18);
  uVar180 = CONCAT11(uVar325,uVar325);
  uVar325 = (undefined1)((uint)uVar22 >> 0x10);
  uVar187 = CONCAT35(CONCAT21(uVar180,uVar325),CONCAT14(uVar325,uVar22));
  uVar325 = (undefined1)((uint)uVar22 >> 8);
  uVar72 = CONCAT51(CONCAT41((int)((ulong)uVar187 >> 0x20),uVar325),uVar325);
  sVar120 = CONCAT11((char)uVar22,(char)uVar22);
  uVar106 = CONCAT62(uVar72,sVar120);
  auVar401._8_4_ = 0;
  auVar401._0_8_ = uVar106;
  auVar401._12_2_ = uVar180;
  auVar401._14_2_ = uVar180;
  uVar180 = (undefined2)((ulong)uVar187 >> 0x20);
  auVar400._12_4_ = auVar401._12_4_;
  auVar400._8_2_ = 0;
  auVar400._0_8_ = uVar106;
  auVar400._10_2_ = uVar180;
  auVar399._10_6_ = auVar400._10_6_;
  auVar399._8_2_ = uVar180;
  auVar399._0_8_ = uVar106;
  uVar180 = (undefined2)uVar72;
  auVar73._4_8_ = auVar399._8_8_;
  auVar73._2_2_ = uVar180;
  auVar73._0_2_ = uVar180;
  fVar225 = (float)((int)sVar120 >> 8);
  fVar241 = (float)(auVar73._0_4_ >> 0x18);
  fVar242 = (float)(auVar399._8_4_ >> 0x18);
  uVar325 = (undefined1)((uint)uVar25 >> 0x18);
  uVar180 = CONCAT11(uVar325,uVar325);
  uVar325 = (undefined1)((uint)uVar25 >> 0x10);
  uVar187 = CONCAT35(CONCAT21(uVar180,uVar325),CONCAT14(uVar325,uVar25));
  uVar325 = (undefined1)((uint)uVar25 >> 8);
  uVar72 = CONCAT51(CONCAT41((int)((ulong)uVar187 >> 0x20),uVar325),uVar325);
  sVar120 = CONCAT11((char)uVar25,(char)uVar25);
  uVar106 = CONCAT62(uVar72,sVar120);
  auVar382._8_4_ = 0;
  auVar382._0_8_ = uVar106;
  auVar382._12_2_ = uVar180;
  auVar382._14_2_ = uVar180;
  uVar180 = (undefined2)((ulong)uVar187 >> 0x20);
  auVar381._12_4_ = auVar382._12_4_;
  auVar381._8_2_ = 0;
  auVar381._0_8_ = uVar106;
  auVar381._10_2_ = uVar180;
  auVar380._10_6_ = auVar381._10_6_;
  auVar380._8_2_ = uVar180;
  auVar380._0_8_ = uVar106;
  uVar180 = (undefined2)uVar72;
  auVar74._4_8_ = auVar380._8_8_;
  auVar74._2_2_ = uVar180;
  auVar74._0_2_ = uVar180;
  fVar269 = (float)((int)sVar120 >> 8);
  fVar278 = (float)(auVar74._0_4_ >> 0x18);
  fVar279 = (float)(auVar380._8_4_ >> 0x18);
  uVar325 = (undefined1)((uint)uVar26 >> 0x18);
  uVar180 = CONCAT11(uVar325,uVar325);
  uVar325 = (undefined1)((uint)uVar26 >> 0x10);
  uVar187 = CONCAT35(CONCAT21(uVar180,uVar325),CONCAT14(uVar325,uVar26));
  uVar325 = (undefined1)((uint)uVar26 >> 8);
  uVar72 = CONCAT51(CONCAT41((int)((ulong)uVar187 >> 0x20),uVar325),uVar325);
  sVar120 = CONCAT11((char)uVar26,(char)uVar26);
  uVar106 = CONCAT62(uVar72,sVar120);
  auVar331._8_4_ = 0;
  auVar331._0_8_ = uVar106;
  auVar331._12_2_ = uVar180;
  auVar331._14_2_ = uVar180;
  uVar180 = (undefined2)((ulong)uVar187 >> 0x20);
  auVar330._12_4_ = auVar331._12_4_;
  auVar330._8_2_ = 0;
  auVar330._0_8_ = uVar106;
  auVar330._10_2_ = uVar180;
  auVar329._10_6_ = auVar330._10_6_;
  auVar329._8_2_ = uVar180;
  auVar329._0_8_ = uVar106;
  uVar180 = (undefined2)uVar72;
  auVar75._4_8_ = auVar329._8_8_;
  auVar75._2_2_ = uVar180;
  auVar75._0_2_ = uVar180;
  fVar395 = (float)((int)sVar120 >> 8);
  fVar403 = (float)(auVar75._0_4_ >> 0x18);
  fVar408 = (float)(auVar329._8_4_ >> 0x18);
  uVar325 = (undefined1)((uint)uVar20 >> 0x18);
  uVar180 = CONCAT11(uVar325,uVar325);
  uVar325 = (undefined1)((uint)uVar20 >> 0x10);
  uVar187 = CONCAT35(CONCAT21(uVar180,uVar325),CONCAT14(uVar325,uVar20));
  uVar325 = (undefined1)((uint)uVar20 >> 8);
  uVar72 = CONCAT51(CONCAT41((int)((ulong)uVar187 >> 0x20),uVar325),uVar325);
  sVar120 = CONCAT11((char)uVar20,(char)uVar20);
  uVar106 = CONCAT62(uVar72,sVar120);
  auVar323._8_4_ = 0;
  auVar323._0_8_ = uVar106;
  auVar323._12_2_ = uVar180;
  auVar323._14_2_ = uVar180;
  uVar180 = (undefined2)((ulong)uVar187 >> 0x20);
  auVar322._12_4_ = auVar323._12_4_;
  auVar322._8_2_ = 0;
  auVar322._0_8_ = uVar106;
  auVar322._10_2_ = uVar180;
  auVar321._10_6_ = auVar322._10_6_;
  auVar321._8_2_ = uVar180;
  auVar321._0_8_ = uVar106;
  uVar180 = (undefined2)uVar72;
  auVar76._4_8_ = auVar321._8_8_;
  auVar76._2_2_ = uVar180;
  auVar76._0_2_ = uVar180;
  fVar320 = (float)((int)sVar120 >> 8);
  fVar326 = (float)(auVar76._0_4_ >> 0x18);
  fVar327 = (float)(auVar321._8_4_ >> 0x18);
  fVar379 = fVar364 * fVar293 + fVar371 * (float)iVar121 + fVar374 * (float)iVar181;
  fVar389 = fVar364 * fVar302 + fVar371 * fVar346 + fVar374 * fVar360;
  fVar390 = fVar364 * fVar305 + fVar371 * (float)auVar124._8_4_ + fVar374 * (float)auVar125._8_4_;
  fVar391 = fVar364 * (float)(auVar229._12_4_ >> 0x18) +
            fVar371 * (float)auVar130._12_4_ + fVar374 * (float)auVar134._12_4_;
  fVar328 = fVar364 * fVar225 + fVar371 * (float)iVar182 + fVar224;
  fVar334 = fVar364 * fVar241 + fVar371 * fVar313 + fVar240;
  fVar335 = fVar364 * fVar242 + fVar371 * (float)auVar126._8_4_ + auVar226._8_4_;
  fVar336 = fVar364 * (float)(auVar400._12_4_ >> 0x18) +
            fVar371 * (float)auVar138._12_4_ + auVar227._12_4_;
  fVar224 = fVar364 * fVar269 + fVar371 * fVar395 + fVar374 * fVar320;
  fVar240 = fVar364 * fVar278 + fVar371 * fVar403 + fVar374 * fVar326;
  fVar264 = fVar364 * fVar279 + fVar371 * fVar408 + fVar374 * fVar327;
  fVar364 = fVar364 * (float)(auVar381._12_4_ >> 0x18) +
            fVar371 * (float)(auVar330._12_4_ >> 0x18) + fVar374 * (float)(auVar322._12_4_ >> 0x18);
  uVar187 = *(undefined8 *)(prim + uVar101 * 7 + 6);
  uVar9 = *(undefined8 *)(prim + uVar101 * 0xb + 6);
  uVar10 = *(undefined8 *)(prim + uVar101 * 9 + 6);
  fVar371 = fVar293 * fVar280 + (float)iVar121 * fVar291 + (float)iVar181 * fVar292;
  fVar346 = fVar302 * fVar280 + fVar346 * fVar291 + fVar360 * fVar292;
  fVar360 = fVar305 * fVar280 + (float)auVar124._8_4_ * fVar291 + (float)auVar125._8_4_ * fVar292;
  fVar374 = (float)(auVar229._12_4_ >> 0x18) * fVar280 +
            (float)auVar130._12_4_ * fVar291 + (float)auVar134._12_4_ * fVar292;
  fVar365 = fVar225 * fVar280 + (float)iVar182 * fVar291 + fVar190 * fVar292;
  fVar372 = fVar241 * fVar280 + fVar313 * fVar291 + fVar218 * fVar292;
  fVar375 = fVar242 * fVar280 + (float)auVar126._8_4_ * fVar291 + fVar220 * fVar292;
  fVar377 = (float)(auVar400._12_4_ >> 0x18) * fVar280 +
            (float)auVar138._12_4_ * fVar291 + (float)(auVar140._12_4_ >> 0x18) * fVar292;
  fVar293 = fVar280 * fVar269 + fVar291 * fVar395 + fVar292 * fVar320;
  fVar302 = fVar280 * fVar278 + fVar291 * fVar403 + fVar292 * fVar326;
  fVar305 = fVar280 * fVar279 + fVar291 * fVar408 + fVar292 * fVar327;
  fVar313 = fVar280 * (float)(auVar381._12_4_ >> 0x18) +
            fVar291 * (float)(auVar330._12_4_ >> 0x18) + fVar292 * (float)(auVar322._12_4_ >> 0x18);
  uVar113 = -(uint)(1e-18 <= ABS(fVar379));
  uVar114 = -(uint)(1e-18 <= ABS(fVar389));
  uVar115 = -(uint)(1e-18 <= ABS(fVar390));
  uVar117 = -(uint)(1e-18 <= ABS(fVar391));
  auVar383._0_4_ = (uint)fVar379 & uVar113;
  auVar383._4_4_ = (uint)fVar389 & uVar114;
  auVar383._8_4_ = (uint)fVar390 & uVar115;
  auVar383._12_4_ = (uint)fVar391 & uVar117;
  auVar142._0_8_ = CONCAT44(~uVar114,~uVar113) & 0x219392ef219392ef;
  auVar142._8_4_ = ~uVar115 & 0x219392ef;
  auVar142._12_4_ = ~uVar117 & 0x219392ef;
  auVar142 = auVar142 | auVar383;
  uVar113 = -(uint)(1e-18 <= ABS(fVar328));
  uVar114 = -(uint)(1e-18 <= ABS(fVar334));
  uVar115 = -(uint)(1e-18 <= ABS(fVar335));
  uVar117 = -(uint)(1e-18 <= ABS(fVar336));
  auVar332._0_4_ = (uint)fVar328 & uVar113;
  auVar332._4_4_ = (uint)fVar334 & uVar114;
  auVar332._8_4_ = (uint)fVar335 & uVar115;
  auVar332._12_4_ = (uint)fVar336 & uVar117;
  auVar295._0_8_ = CONCAT44(~uVar114,~uVar113) & 0x219392ef219392ef;
  auVar295._8_4_ = ~uVar115 & 0x219392ef;
  auVar295._12_4_ = ~uVar117 & 0x219392ef;
  auVar295 = auVar295 | auVar332;
  uVar113 = -(uint)(1e-18 <= ABS(fVar224));
  uVar114 = -(uint)(1e-18 <= ABS(fVar240));
  uVar115 = -(uint)(1e-18 <= ABS(fVar264));
  uVar117 = -(uint)(1e-18 <= ABS(fVar364));
  auVar245._0_4_ = (uint)fVar224 & uVar113;
  auVar245._4_4_ = (uint)fVar240 & uVar114;
  auVar245._8_4_ = (uint)fVar264 & uVar115;
  auVar245._12_4_ = (uint)fVar364 & uVar117;
  auVar384._0_8_ = CONCAT44(~uVar114,~uVar113) & 0x219392ef219392ef;
  auVar384._8_4_ = ~uVar115 & 0x219392ef;
  auVar384._12_4_ = ~uVar117 & 0x219392ef;
  auVar384 = auVar384 | auVar245;
  auVar246 = rcpps(auVar245,auVar142);
  auVar247._0_4_ = auVar246._0_4_;
  auVar143._0_4_ = auVar142._0_4_ * auVar247._0_4_;
  fVar320 = auVar246._4_4_;
  auVar143._4_4_ = auVar142._4_4_ * fVar320;
  fVar326 = auVar246._8_4_;
  auVar143._8_4_ = auVar142._8_4_ * fVar326;
  fVar327 = auVar246._12_4_;
  auVar143._12_4_ = auVar142._12_4_ * fVar327;
  fVar334 = (1.0 - auVar143._0_4_) * auVar247._0_4_ + auVar247._0_4_;
  fVar320 = (1.0 - auVar143._4_4_) * fVar320 + fVar320;
  fVar326 = (1.0 - auVar143._8_4_) * fVar326 + fVar326;
  fVar327 = (1.0 - auVar143._12_4_) * fVar327 + fVar327;
  auVar144 = rcpps(auVar143,auVar295);
  fVar190 = auVar144._0_4_;
  fVar218 = auVar144._4_4_;
  fVar264 = auVar144._8_4_;
  fVar291 = auVar144._12_4_;
  fVar190 = (1.0 - auVar295._0_4_ * fVar190) * fVar190 + fVar190;
  fVar218 = (1.0 - auVar295._4_4_ * fVar218) * fVar218 + fVar218;
  fVar264 = (1.0 - auVar295._8_4_ * fVar264) * fVar264 + fVar264;
  fVar291 = (1.0 - auVar295._12_4_ * fVar291) * fVar291 + fVar291;
  auVar144 = rcpps(auVar144,auVar384);
  auVar145._0_4_ = auVar144._0_4_;
  fVar220 = auVar144._4_4_;
  fVar364 = auVar144._8_4_;
  fVar292 = auVar144._12_4_;
  fVar328 = (1.0 - auVar384._0_4_ * auVar145._0_4_) * auVar145._0_4_ + auVar145._0_4_;
  fVar220 = (1.0 - auVar384._4_4_ * fVar220) * fVar220 + fVar220;
  fVar364 = (1.0 - auVar384._8_4_ * fVar364) * fVar364 + fVar364;
  fVar292 = (1.0 - auVar384._12_4_ * fVar292) * fVar292 + fVar292;
  local_4d8 = (short)uVar187;
  uStack_4d6 = (undefined2)((ulong)uVar187 >> 0x10);
  uStack_4d4 = (undefined2)((ulong)uVar187 >> 0x20);
  uStack_4d2 = (undefined2)((ulong)uVar187 >> 0x30);
  auVar148._0_12_ = auVar144._0_12_;
  auVar148._12_2_ = auVar144._6_2_;
  auVar148._14_2_ = uStack_4d2;
  auVar147._12_4_ = auVar148._12_4_;
  auVar147._0_10_ = auVar144._0_10_;
  auVar147._10_2_ = uStack_4d4;
  auVar146._10_6_ = auVar147._10_6_;
  auVar146._0_8_ = auVar144._0_8_;
  auVar146._8_2_ = auVar144._4_2_;
  auVar145._8_8_ = auVar146._8_8_;
  auVar145._6_2_ = uStack_4d6;
  auVar145._4_2_ = auVar144._2_2_;
  auVar149._0_4_ = (float)(int)local_4d8;
  fVar224 = (float)(auVar145._4_4_ >> 0x10);
  auVar127._0_8_ = CONCAT44(fVar224,auVar149._0_4_);
  auVar127._8_4_ = (float)(auVar146._8_4_ >> 0x10);
  local_518._0_2_ = (undefined2)uVar9;
  local_518._2_2_ = (undefined2)((ulong)uVar9 >> 0x10);
  local_518._4_2_ = (undefined2)((ulong)uVar9 >> 0x20);
  uStack_512 = (undefined2)((ulong)uVar9 >> 0x30);
  auVar250._0_12_ = auVar246._0_12_;
  auVar250._12_2_ = auVar246._6_2_;
  auVar250._14_2_ = uStack_512;
  auVar249._12_4_ = auVar250._12_4_;
  auVar249._0_10_ = auVar246._0_10_;
  auVar249._10_2_ = local_518._4_2_;
  auVar248._10_6_ = auVar249._10_6_;
  auVar248._0_8_ = auVar246._0_8_;
  auVar248._8_2_ = auVar246._4_2_;
  auVar247._8_8_ = auVar248._8_8_;
  auVar247._6_2_ = local_518._2_2_;
  auVar247._4_2_ = auVar246._2_2_;
  auVar152._12_2_ = (short)((uint)fVar224 >> 0x10);
  auVar152._0_12_ = auVar127;
  auVar152._14_2_ = (short)((ulong)uVar10 >> 0x30);
  auVar151._12_4_ = auVar152._12_4_;
  auVar151._0_10_ = auVar127._0_10_;
  auVar151._10_2_ = (short)((ulong)uVar10 >> 0x20);
  auVar150._10_6_ = auVar151._10_6_;
  auVar150._8_2_ = SUB42(fVar224,0);
  auVar150._0_8_ = auVar127._0_8_;
  auVar149._8_8_ = auVar150._8_8_;
  auVar149._6_2_ = (short)((ulong)uVar10 >> 0x10);
  auVar149._4_2_ = (short)((uint)auVar149._0_4_ >> 0x10);
  fVar225 = (float)(auVar149._4_4_ >> 0x10);
  fVar269 = (float)(auVar150._8_4_ >> 0x10);
  uVar106 = *(ulong *)(prim + uVar101 * 0xd + 6);
  uVar180 = (undefined2)(uVar106 >> 0x30);
  auVar283._8_4_ = 0;
  auVar283._0_8_ = uVar106;
  auVar283._12_2_ = uVar180;
  auVar283._14_2_ = uVar180;
  uVar180 = (undefined2)(uVar106 >> 0x20);
  auVar282._12_4_ = auVar283._12_4_;
  auVar282._8_2_ = 0;
  auVar282._0_8_ = uVar106;
  auVar282._10_2_ = uVar180;
  auVar281._10_6_ = auVar282._10_6_;
  auVar281._8_2_ = uVar180;
  auVar281._0_8_ = uVar106;
  uVar180 = (undefined2)(uVar106 >> 0x10);
  auVar77._4_8_ = auVar281._8_8_;
  auVar77._2_2_ = uVar180;
  auVar77._0_2_ = uVar180;
  uVar11 = *(ulong *)(prim + uVar101 * 0x12 + 6);
  uVar180 = (undefined2)(uVar11 >> 0x30);
  auVar155._8_4_ = 0;
  auVar155._0_8_ = uVar11;
  auVar155._12_2_ = uVar180;
  auVar155._14_2_ = uVar180;
  uVar180 = (undefined2)(uVar11 >> 0x20);
  auVar154._12_4_ = auVar155._12_4_;
  auVar154._8_2_ = 0;
  auVar154._0_8_ = uVar11;
  auVar154._10_2_ = uVar180;
  auVar153._10_6_ = auVar154._10_6_;
  auVar153._8_2_ = uVar180;
  auVar153._0_8_ = uVar11;
  uVar180 = (undefined2)(uVar11 >> 0x10);
  auVar78._4_8_ = auVar153._8_8_;
  auVar78._2_2_ = uVar180;
  auVar78._0_2_ = uVar180;
  fVar240 = (float)(auVar78._0_4_ >> 0x10);
  fVar278 = (float)(auVar153._8_4_ >> 0x10);
  uVar12 = *(ulong *)(prim + uVar101 * 0x16 + 6);
  uVar180 = (undefined2)(uVar12 >> 0x30);
  auVar298._8_4_ = 0;
  auVar298._0_8_ = uVar12;
  auVar298._12_2_ = uVar180;
  auVar298._14_2_ = uVar180;
  uVar180 = (undefined2)(uVar12 >> 0x20);
  auVar297._12_4_ = auVar298._12_4_;
  auVar297._8_2_ = 0;
  auVar297._0_8_ = uVar12;
  auVar297._10_2_ = uVar180;
  auVar296._10_6_ = auVar297._10_6_;
  auVar296._8_2_ = uVar180;
  auVar296._0_8_ = uVar12;
  uVar180 = (undefined2)(uVar12 >> 0x10);
  auVar79._4_8_ = auVar296._8_8_;
  auVar79._2_2_ = uVar180;
  auVar79._0_2_ = uVar180;
  uVar13 = *(ulong *)(prim + uVar101 * 0x14 + 6);
  uVar180 = (undefined2)(uVar13 >> 0x30);
  auVar158._8_4_ = 0;
  auVar158._0_8_ = uVar13;
  auVar158._12_2_ = uVar180;
  auVar158._14_2_ = uVar180;
  uVar180 = (undefined2)(uVar13 >> 0x20);
  auVar157._12_4_ = auVar158._12_4_;
  auVar157._8_2_ = 0;
  auVar157._0_8_ = uVar13;
  auVar157._10_2_ = uVar180;
  auVar156._10_6_ = auVar157._10_6_;
  auVar156._8_2_ = uVar180;
  auVar156._0_8_ = uVar13;
  uVar180 = (undefined2)(uVar13 >> 0x10);
  auVar80._4_8_ = auVar156._8_8_;
  auVar80._2_2_ = uVar180;
  auVar80._0_2_ = uVar180;
  fVar241 = (float)(auVar80._0_4_ >> 0x10);
  fVar279 = (float)(auVar156._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar101 * 0x18 + 6);
  uVar180 = (undefined2)(uVar14 >> 0x30);
  auVar340._8_4_ = 0;
  auVar340._0_8_ = uVar14;
  auVar340._12_2_ = uVar180;
  auVar340._14_2_ = uVar180;
  uVar180 = (undefined2)(uVar14 >> 0x20);
  auVar339._12_4_ = auVar340._12_4_;
  auVar339._8_2_ = 0;
  auVar339._0_8_ = uVar14;
  auVar339._10_2_ = uVar180;
  auVar338._10_6_ = auVar339._10_6_;
  auVar338._8_2_ = uVar180;
  auVar338._0_8_ = uVar14;
  uVar180 = (undefined2)(uVar14 >> 0x10);
  auVar81._4_8_ = auVar338._8_8_;
  auVar81._2_2_ = uVar180;
  auVar81._0_2_ = uVar180;
  uVar15 = *(ulong *)(prim + uVar101 * 0x1d + 6);
  uVar180 = (undefined2)(uVar15 >> 0x30);
  auVar161._8_4_ = 0;
  auVar161._0_8_ = uVar15;
  auVar161._12_2_ = uVar180;
  auVar161._14_2_ = uVar180;
  uVar180 = (undefined2)(uVar15 >> 0x20);
  auVar160._12_4_ = auVar161._12_4_;
  auVar160._8_2_ = 0;
  auVar160._0_8_ = uVar15;
  auVar160._10_2_ = uVar180;
  auVar159._10_6_ = auVar160._10_6_;
  auVar159._8_2_ = uVar180;
  auVar159._0_8_ = uVar15;
  uVar180 = (undefined2)(uVar15 >> 0x10);
  auVar82._4_8_ = auVar159._8_8_;
  auVar82._2_2_ = uVar180;
  auVar82._0_2_ = uVar180;
  fVar242 = (float)(auVar82._0_4_ >> 0x10);
  fVar280 = (float)(auVar159._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar101 * 0x21 + 6);
  uVar180 = (undefined2)(uVar16 >> 0x30);
  auVar355._8_4_ = 0;
  auVar355._0_8_ = uVar16;
  auVar355._12_2_ = uVar180;
  auVar355._14_2_ = uVar180;
  uVar180 = (undefined2)(uVar16 >> 0x20);
  auVar354._12_4_ = auVar355._12_4_;
  auVar354._8_2_ = 0;
  auVar354._0_8_ = uVar16;
  auVar354._10_2_ = uVar180;
  auVar353._10_6_ = auVar354._10_6_;
  auVar353._8_2_ = uVar180;
  auVar353._0_8_ = uVar16;
  uVar180 = (undefined2)(uVar16 >> 0x10);
  auVar83._4_8_ = auVar353._8_8_;
  auVar83._2_2_ = uVar180;
  auVar83._0_2_ = uVar180;
  uVar17 = *(ulong *)(prim + uVar101 * 0x1f + 6);
  uVar180 = (undefined2)(uVar17 >> 0x30);
  auVar164._8_4_ = 0;
  auVar164._0_8_ = uVar17;
  auVar164._12_2_ = uVar180;
  auVar164._14_2_ = uVar180;
  uVar180 = (undefined2)(uVar17 >> 0x20);
  auVar163._12_4_ = auVar164._12_4_;
  auVar163._8_2_ = 0;
  auVar163._0_8_ = uVar17;
  auVar163._10_2_ = uVar180;
  auVar162._10_6_ = auVar163._10_6_;
  auVar162._8_2_ = uVar180;
  auVar162._0_8_ = uVar17;
  uVar180 = (undefined2)(uVar17 >> 0x10);
  auVar84._4_8_ = auVar162._8_8_;
  auVar84._2_2_ = uVar180;
  auVar84._0_2_ = uVar180;
  fVar335 = (float)(auVar84._0_4_ >> 0x10);
  fVar336 = (float)(auVar162._8_4_ >> 0x10);
  uVar18 = *(ulong *)(prim + uVar101 * 0x23 + 6);
  uVar180 = (undefined2)(uVar18 >> 0x30);
  auVar167._8_4_ = 0;
  auVar167._0_8_ = uVar18;
  auVar167._12_2_ = uVar180;
  auVar167._14_2_ = uVar180;
  uVar180 = (undefined2)(uVar18 >> 0x20);
  auVar166._12_4_ = auVar167._12_4_;
  auVar166._8_2_ = 0;
  auVar166._0_8_ = uVar18;
  auVar166._10_2_ = uVar180;
  auVar165._10_6_ = auVar166._10_6_;
  auVar165._8_2_ = uVar180;
  auVar165._0_8_ = uVar18;
  uVar180 = (undefined2)(uVar18 >> 0x10);
  auVar85._4_8_ = auVar165._8_8_;
  auVar85._2_2_ = uVar180;
  auVar85._0_2_ = uVar180;
  uVar100 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar251._0_8_ =
       CONCAT44(((((float)(auVar247._4_4_ >> 0x10) - fVar224) * fVar189 + fVar224) - fVar346) *
                fVar320,((((float)(int)(short)local_518._0_2_ - auVar149._0_4_) * fVar189 +
                         auVar149._0_4_) - fVar371) * fVar334);
  auVar251._8_4_ =
       ((((float)(auVar248._8_4_ >> 0x10) - auVar127._8_4_) * fVar189 + auVar127._8_4_) - fVar360) *
       fVar326;
  auVar251._12_4_ =
       ((((float)(auVar249._12_4_ >> 0x10) - (float)(auVar147._12_4_ >> 0x10)) * fVar189 +
        (float)(auVar147._12_4_ >> 0x10)) - fVar374) * fVar327;
  auVar284._0_4_ =
       ((((float)(int)(short)uVar106 - (float)(int)(short)uVar10) * fVar189 +
        (float)(int)(short)uVar10) - fVar371) * fVar334;
  auVar284._4_4_ =
       ((((float)(auVar77._0_4_ >> 0x10) - fVar225) * fVar189 + fVar225) - fVar346) * fVar320;
  auVar284._8_4_ =
       ((((float)(auVar281._8_4_ >> 0x10) - fVar269) * fVar189 + fVar269) - fVar360) * fVar326;
  auVar284._12_4_ =
       ((((float)(auVar282._12_4_ >> 0x10) - (float)(auVar151._12_4_ >> 0x10)) * fVar189 +
        (float)(auVar151._12_4_ >> 0x10)) - fVar374) * fVar327;
  auVar299._0_8_ =
       CONCAT44(((((float)(auVar79._0_4_ >> 0x10) - fVar240) * fVar189 + fVar240) - fVar372) *
                fVar218,((((float)(int)(short)uVar12 - (float)(int)(short)uVar11) * fVar189 +
                         (float)(int)(short)uVar11) - fVar365) * fVar190);
  auVar299._8_4_ =
       ((((float)(auVar296._8_4_ >> 0x10) - fVar278) * fVar189 + fVar278) - fVar375) * fVar264;
  auVar299._12_4_ =
       ((((float)(auVar297._12_4_ >> 0x10) - (float)(auVar154._12_4_ >> 0x10)) * fVar189 +
        (float)(auVar154._12_4_ >> 0x10)) - fVar377) * fVar291;
  aVar341._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar13) * fVar189 +
        (float)(int)(short)uVar13) - fVar365) * fVar190;
  aVar341._4_4_ =
       ((((float)(auVar81._0_4_ >> 0x10) - fVar241) * fVar189 + fVar241) - fVar372) * fVar218;
  aVar341._8_4_ =
       ((((float)(auVar338._8_4_ >> 0x10) - fVar279) * fVar189 + fVar279) - fVar375) * fVar264;
  aVar341._12_4_ =
       ((((float)(auVar339._12_4_ >> 0x10) - (float)(auVar157._12_4_ >> 0x10)) * fVar189 +
        (float)(auVar157._12_4_ >> 0x10)) - fVar377) * fVar291;
  auVar356._0_8_ =
       CONCAT44(((((float)(auVar83._0_4_ >> 0x10) - fVar242) * fVar189 + fVar242) - fVar302) *
                fVar220,((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar189 +
                         (float)(int)(short)uVar15) - fVar293) * fVar328);
  auVar356._8_4_ =
       ((((float)(auVar353._8_4_ >> 0x10) - fVar280) * fVar189 + fVar280) - fVar305) * fVar364;
  auVar356._12_4_ =
       ((((float)(auVar354._12_4_ >> 0x10) - (float)(auVar160._12_4_ >> 0x10)) * fVar189 +
        (float)(auVar160._12_4_ >> 0x10)) - fVar313) * fVar292;
  auVar367._0_4_ =
       ((((float)(int)(short)uVar18 - (float)(int)(short)uVar17) * fVar189 +
        (float)(int)(short)uVar17) - fVar293) * fVar328;
  auVar367._4_4_ =
       ((((float)(auVar85._0_4_ >> 0x10) - fVar335) * fVar189 + fVar335) - fVar302) * fVar220;
  auVar367._8_4_ =
       ((((float)(auVar165._8_4_ >> 0x10) - fVar336) * fVar189 + fVar336) - fVar305) * fVar364;
  auVar367._12_4_ =
       ((((float)(auVar166._12_4_ >> 0x10) - (float)(auVar163._12_4_ >> 0x10)) * fVar189 +
        (float)(auVar163._12_4_ >> 0x10)) - fVar313) * fVar292;
  auVar231._8_4_ = auVar251._8_4_;
  auVar231._0_8_ = auVar251._0_8_;
  auVar231._12_4_ = auVar251._12_4_;
  auVar246 = minps(auVar231,auVar284);
  auVar192._8_4_ = auVar299._8_4_;
  auVar192._0_8_ = auVar299._0_8_;
  auVar192._12_4_ = auVar299._12_4_;
  auVar144 = minps(auVar192,(undefined1  [16])aVar341);
  auVar246 = maxps(auVar246,auVar144);
  auVar193._8_4_ = auVar356._8_4_;
  auVar193._0_8_ = auVar356._0_8_;
  auVar193._12_4_ = auVar356._12_4_;
  auVar144 = minps(auVar193,auVar367);
  auVar168._4_4_ = uVar100;
  auVar168._0_4_ = uVar100;
  auVar168._8_4_ = uVar100;
  auVar168._12_4_ = uVar100;
  auVar144 = maxps(auVar144,auVar168);
  auVar144 = maxps(auVar246,auVar144);
  local_48 = auVar144._0_4_ * 0.99999964;
  fStack_44 = auVar144._4_4_ * 0.99999964;
  fStack_40 = auVar144._8_4_ * 0.99999964;
  fStack_3c = auVar144._12_4_ * 0.99999964;
  auVar144 = maxps(auVar251,auVar284);
  auVar246 = maxps(auVar299,(undefined1  [16])aVar341);
  auVar144 = minps(auVar144,auVar246);
  auVar246 = maxps(auVar356,auVar367);
  uVar100 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar194._4_4_ = uVar100;
  auVar194._0_4_ = uVar100;
  auVar194._8_4_ = uVar100;
  auVar194._12_4_ = uVar100;
  aVar357 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)minps(auVar246,auVar194);
  auVar144 = minps(auVar144,(undefined1  [16])aVar357);
  auVar195._0_4_ = -(uint)(PVar19 != (Primitive)0x0 && local_48 <= auVar144._0_4_ * 1.0000004);
  auVar195._4_4_ = -(uint)(1 < (byte)PVar19 && fStack_44 <= auVar144._4_4_ * 1.0000004);
  auVar195._8_4_ = -(uint)(2 < (byte)PVar19 && fStack_40 <= auVar144._8_4_ * 1.0000004);
  auVar195._12_4_ = -(uint)(3 < (byte)PVar19 && fStack_3c <= auVar144._12_4_ * 1.0000004);
  uVar113 = movmskps((int)(uVar101 * 0xd),auVar195);
  local_408 = mm_lookupmask_ps._0_8_;
  uStack_400 = mm_lookupmask_ps._8_8_;
  lVar107 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  for (; uVar113 != 0; uVar113 = uVar113 & uVar113 + 0xf & uVar114) {
    lVar110 = 0;
    if (uVar113 != 0) {
      for (; (uVar113 >> lVar110 & 1) == 0; lVar110 = lVar110 + 1) {
      }
    }
    uStack_2d0._0_4_ = *(uint *)(prim + 2);
    pRVar105 = (RTCIntersectArguments *)(ulong)(uint)uStack_2d0;
    uVar114 = *(uint *)(prim + lVar110 * 4 + 6);
    pGVar27 = (context->scene->geometries).items[(long)pRVar105].ptr;
    uVar106 = (ulong)*(uint *)(*(long *)&pGVar27->field_0x58 +
                              (ulong)uVar114 *
                              pGVar27[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar190 = pGVar27->fnumTimeSegments;
    fVar218 = (pGVar27->time_range).lower;
    fVar220 = ((*(float *)(ray + k * 4 + 0x70) - fVar218) / ((pGVar27->time_range).upper - fVar218))
              * fVar190;
    fVar218 = floorf(fVar220);
    fVar190 = fVar190 + -1.0;
    if (fVar190 <= fVar218) {
      fVar218 = fVar190;
    }
    fVar190 = 0.0;
    if (0.0 <= fVar218) {
      fVar190 = fVar218;
    }
    _Var28 = pGVar27[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar102 = (long)(int)fVar190 * 0x38;
    lVar111 = *(long *)(_Var28 + 0x10 + lVar102);
    lVar112 = *(long *)(_Var28 + 0x38 + lVar102);
    lVar29 = *(long *)(_Var28 + 0x48 + lVar102);
    pfVar1 = (float *)(lVar112 + lVar29 * uVar106);
    lVar110 = uVar106 + 1;
    pfVar2 = (float *)(lVar112 + lVar29 * lVar110);
    p_Var103 = pGVar27[4].occlusionFilterN;
    pfVar3 = (float *)(*(long *)(_Var28 + lVar102) + lVar111 * uVar106);
    pfVar4 = (float *)(*(long *)(_Var28 + lVar102) + lVar111 * lVar110);
    pGVar109 = *(Geometry **)(p_Var103 + lVar102 + 0x38);
    pRVar108 = (RTCIntersectArguments *)(*(long *)(p_Var103 + lVar102 + 0x10) * lVar110);
    ppp_Var5 = (_func_int ***)
               ((long)&(pGVar109->super_RefCount)._vptr_RefCount +
               uVar106 * *(long *)(p_Var103 + lVar102 + 0x48));
    pfVar6 = (float *)(*(long *)(p_Var103 + lVar102) +
                      *(long *)(p_Var103 + lVar102 + 0x10) * uVar106);
    fVar220 = fVar220 - fVar190;
    fVar225 = 1.0 - fVar220;
    fVar279 = *pfVar3 * fVar225 + *pfVar1 * fVar220;
    fVar291 = pfVar3[1] * fVar225 + pfVar1[1] * fVar220;
    fVar189 = pfVar3[2] * fVar225 + pfVar1[2] * fVar220;
    fVar302 = pfVar3[3] * fVar225 + pfVar1[3] * fVar220;
    ppp_Var7 = (_func_int ***)
               ((long)&(pGVar109->super_RefCount)._vptr_RefCount +
               *(long *)(p_Var103 + lVar102 + 0x48) * lVar110);
    local_3d8 = *pfVar4 * fVar225 + *pfVar2 * fVar220;
    fStack_3d4 = pfVar4[1] * fVar225 + pfVar2[1] * fVar220;
    fStack_3d0 = pfVar4[2] * fVar225 + pfVar2[2] * fVar220;
    fVar334 = pfVar4[3] * fVar225 + pfVar2[3] * fVar220;
    pfVar1 = (float *)((long)&pRVar108->flags + *(long *)(p_Var103 + lVar102));
    iVar121 = (int)pGVar27[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    fVar190 = *(float *)(ray + k * 4);
    fVar218 = *(float *)(ray + k * 4 + 0x10);
    fVar224 = *(float *)(ray + k * 4 + 0x20);
    local_3e8 = (*pfVar6 * fVar225 + *(float *)ppp_Var5 * fVar220) * 0.33333334 + fVar279;
    fStack_3e4 = (pfVar6[1] * fVar225 + *(float *)((long)ppp_Var5 + 4) * fVar220) * 0.33333334 +
                 fVar291;
    fStack_3e0 = (pfVar6[2] * fVar225 +
                 *(float *)&(((atomic<unsigned_long> *)(ppp_Var5 + 1))->
                            super___atomic_base<unsigned_long>)._M_i * fVar220) * 0.33333334 +
                 fVar189;
    fVar327 = (pfVar6[3] * fVar225 + *(float *)((long)ppp_Var5 + 0xc) * fVar220) * 0.33333334 +
              fVar302;
    local_3f8 = local_3d8 - (fVar225 * *pfVar1 + fVar220 * *(float *)ppp_Var7) * 0.33333334;
    fStack_3f4 = fStack_3d4 -
                 (fVar225 * pfVar1[1] + fVar220 * *(float *)((long)ppp_Var7 + 4)) * 0.33333334;
    fStack_3f0 = fStack_3d0 -
                 (fVar225 * pfVar1[2] +
                 fVar220 * *(float *)&(((atomic<unsigned_long> *)(ppp_Var7 + 1))->
                                      super___atomic_base<unsigned_long>)._M_i) * 0.33333334;
    fVar328 = fVar334 - (fVar225 * pfVar1[3] + fVar220 * *(float *)((long)ppp_Var7 + 0xc)) *
                        0.33333334;
    fVar280 = fVar279 - fVar190;
    fVar292 = fVar291 - fVar218;
    fVar293 = fVar189 - fVar224;
    fVar220 = pre->ray_space[k].vx.field_0.m128[0];
    fVar225 = pre->ray_space[k].vx.field_0.m128[1];
    fVar240 = pre->ray_space[k].vx.field_0.m128[2];
    fVar241 = pre->ray_space[k].vy.field_0.m128[0];
    fVar242 = pre->ray_space[k].vy.field_0.m128[1];
    fVar264 = pre->ray_space[k].vy.field_0.m128[2];
    fVar364 = pre->ray_space[k].vz.field_0.m128[0];
    fVar269 = pre->ray_space[k].vz.field_0.m128[1];
    fVar278 = pre->ray_space[k].vz.field_0.m128[2];
    fVar305 = fVar280 * fVar220 + fVar292 * fVar241 + fVar293 * fVar364;
    fVar371 = fVar280 * fVar225 + fVar292 * fVar242 + fVar293 * fVar269;
    fVar360 = fVar280 * fVar240 + fVar292 * fVar264 + fVar293 * fVar278;
    fVar280 = local_3e8 - fVar190;
    fVar292 = fStack_3e4 - fVar218;
    fVar293 = fStack_3e0 - fVar224;
    fVar313 = fVar280 * fVar220 + fVar292 * fVar241 + fVar293 * fVar364;
    fVar346 = fVar280 * fVar225 + fVar292 * fVar242 + fVar293 * fVar269;
    fVar374 = fVar280 * fVar240 + fVar292 * fVar264 + fVar293 * fVar278;
    fVar280 = local_3f8 - fVar190;
    fVar292 = fStack_3f4 - fVar218;
    fVar293 = fStack_3f0 - fVar224;
    fVar320 = fVar280 * fVar220 + fVar292 * fVar241 + fVar293 * fVar364;
    fVar326 = fVar280 * fVar225 + fVar292 * fVar242 + fVar293 * fVar269;
    fVar280 = fVar280 * fVar240 + fVar292 * fVar264 + fVar293 * fVar278;
    fVar190 = local_3d8 - fVar190;
    fVar218 = fStack_3d4 - fVar218;
    fVar224 = fStack_3d0 - fVar224;
    fVar220 = fVar190 * fVar220 + fVar218 * fVar241 + fVar224 * fVar364;
    fVar225 = fVar190 * fVar225 + fVar218 * fVar242 + fVar224 * fVar269;
    fVar218 = fVar190 * fVar240 + fVar218 * fVar264 + fVar224 * fVar278;
    auVar342._0_8_ = CONCAT44(fVar371,fVar305) & 0x7fffffff7fffffff;
    auVar342._8_4_ = ABS(fVar360);
    auVar342._12_4_ = ABS(fVar302);
    auVar270._0_8_ = CONCAT44(fVar346,fVar313) & 0x7fffffff7fffffff;
    auVar270._8_4_ = ABS(fVar374);
    auVar270._12_4_ = ABS(fVar327);
    auVar246 = maxps(auVar342,auVar270);
    auVar285._0_8_ = CONCAT44(fVar326,fVar320) & 0x7fffffff7fffffff;
    auVar285._8_4_ = ABS(fVar280);
    auVar285._12_4_ = ABS(fVar328);
    auVar196._0_8_ = CONCAT44(fVar225,fVar220) & 0x7fffffff7fffffff;
    auVar196._8_4_ = ABS(fVar218);
    auVar196._12_4_ = ABS(fVar334);
    auVar144 = maxps(auVar285,auVar196);
    auVar144 = maxps(auVar246,auVar144);
    uVar187 = auVar144._8_8_;
    fVar190 = auVar144._4_4_;
    if (auVar144._4_4_ <= auVar144._0_4_) {
      fVar190 = auVar144._0_4_;
    }
    auVar343._8_8_ = uVar187;
    auVar343._0_8_ = uVar187;
    fVar224 = (float)iVar121;
    if (auVar144._8_4_ <= fVar190) {
      auVar344._4_12_ = auVar343._4_12_;
      auVar344._0_4_ = fVar190;
      uVar187 = auVar344._0_8_;
    }
    lVar110 = (long)iVar121 * 0x44;
    fVar240 = *(float *)(bezier_basis0 + lVar110 + 0x908);
    fVar241 = *(float *)(bezier_basis0 + lVar110 + 0x90c);
    fVar242 = *(float *)(bezier_basis0 + lVar110 + 0x910);
    fVar264 = *(float *)(bezier_basis0 + lVar110 + 0x914);
    fVar190 = *(float *)*(undefined1 (*) [12])(bezier_basis0 + lVar110 + 0xd8c);
    fVar364 = *(float *)(bezier_basis0 + lVar110 + 0xd90);
    fVar269 = *(float *)(bezier_basis0 + lVar110 + 0xd94);
    auVar64 = *(undefined1 (*) [12])(bezier_basis0 + lVar110 + 0xd8c);
    fVar278 = *(float *)(bezier_basis0 + lVar110 + 0xd98);
    fVar292 = *(float *)(bezier_basis0 + lVar110 + 0x484);
    fVar293 = *(float *)(bezier_basis0 + lVar110 + 0x488);
    fVar335 = *(float *)(bezier_basis0 + lVar110 + 0x48c);
    fVar336 = *(float *)(bezier_basis0 + lVar110 + 0x490);
    fVar365 = *(float *)(bezier_basis0 + lVar110);
    fVar372 = *(float *)(bezier_basis0 + lVar110 + 4);
    fVar375 = *(float *)(bezier_basis0 + lVar110 + 8);
    fVar377 = *(float *)(bezier_basis0 + lVar110 + 0xc);
    fVar243 = fVar305 * fVar365 + fVar313 * fVar292 + fVar320 * fVar240 + fVar220 * fVar190;
    fVar262 = fVar305 * fVar372 + fVar313 * fVar293 + fVar320 * fVar241 + fVar220 * fVar364;
    fVar265 = fVar305 * fVar375 + fVar313 * fVar335 + fVar320 * fVar242 + fVar220 * fVar269;
    fVar267 = fVar305 * fVar377 + fVar313 * fVar336 + fVar320 * fVar264 + fVar220 * fVar278;
    fVar396 = fVar371 * fVar365 + fVar346 * fVar292 + fVar326 * fVar240 + fVar225 * fVar190;
    fVar404 = fVar371 * fVar372 + fVar346 * fVar293 + fVar326 * fVar241 + fVar225 * fVar364;
    fVar409 = fVar371 * fVar375 + fVar346 * fVar335 + fVar326 * fVar242 + fVar225 * fVar269;
    fVar412 = fVar371 * fVar377 + fVar346 * fVar336 + fVar326 * fVar264 + fVar225 * fVar278;
    auVar286._0_4_ = fVar302 * fVar365 + fVar327 * fVar292 + fVar328 * fVar240 + fVar334 * fVar190;
    auVar286._4_4_ = fVar302 * fVar372 + fVar327 * fVar293 + fVar328 * fVar241 + fVar334 * fVar364;
    auVar286._8_4_ = fVar302 * fVar375 + fVar327 * fVar335 + fVar328 * fVar242 + fVar334 * fVar269;
    auVar286._12_4_ = fVar302 * fVar377 + fVar327 * fVar336 + fVar328 * fVar264 + fVar334 * fVar278;
    fVar190 = *(float *)*(undefined1 (*) [12])(bezier_basis1 + lVar110 + 0xd8c);
    fVar364 = *(float *)(bezier_basis1 + lVar110 + 0xd90);
    fVar269 = *(float *)(bezier_basis1 + lVar110 + 0xd94);
    auVar66 = *(undefined1 (*) [12])(bezier_basis1 + lVar110 + 0xd8c);
    fVar379 = *(float *)(bezier_basis1 + lVar110 + 0xd98);
    fVar389 = *(float *)*(undefined1 (*) [12])(bezier_basis1 + lVar110 + 0x908);
    fVar390 = *(float *)(bezier_basis1 + lVar110 + 0x90c);
    fVar391 = *(float *)(bezier_basis1 + lVar110 + 0x910);
    auVar68 = *(undefined1 (*) [12])(bezier_basis1 + lVar110 + 0x908);
    fVar395 = *(float *)(bezier_basis1 + lVar110 + 0x914);
    fVar403 = *(float *)(bezier_basis1 + lVar110 + 0x484);
    fVar408 = *(float *)(bezier_basis1 + lVar110 + 0x488);
    fVar398 = *(float *)(bezier_basis1 + lVar110 + 0x48c);
    fVar407 = *(float *)(bezier_basis1 + lVar110 + 0x490);
    fVar366 = *(float *)(bezier_basis1 + lVar110);
    fVar373 = *(float *)(bezier_basis1 + lVar110 + 4);
    fVar376 = *(float *)(bezier_basis1 + lVar110 + 8);
    fVar378 = *(float *)(bezier_basis1 + lVar110 + 0xc);
    fVar310 = fVar305 * fVar366 + fVar313 * fVar403 + fVar320 * fVar389 + fVar220 * fVar190;
    fVar314 = fVar305 * fVar373 + fVar313 * fVar408 + fVar320 * fVar390 + fVar220 * fVar364;
    fVar316 = fVar305 * fVar376 + fVar313 * fVar398 + fVar320 * fVar391 + fVar220 * fVar269;
    fVar318 = fVar305 * fVar378 + fVar313 * fVar407 + fVar320 * fVar395 + fVar220 * fVar379;
    fVar294 = fVar371 * fVar366 + fVar346 * fVar403 + fVar326 * fVar389 + fVar225 * fVar190;
    fVar303 = fVar371 * fVar373 + fVar346 * fVar408 + fVar326 * fVar390 + fVar225 * fVar364;
    fVar306 = fVar371 * fVar376 + fVar346 * fVar398 + fVar326 * fVar391 + fVar225 * fVar269;
    fVar308 = fVar371 * fVar378 + fVar346 * fVar407 + fVar326 * fVar395 + fVar225 * fVar379;
    auVar368._0_4_ = fVar302 * fVar366 + fVar327 * fVar403 + fVar328 * fVar389 + fVar334 * fVar190;
    auVar368._4_4_ = fVar302 * fVar373 + fVar327 * fVar408 + fVar328 * fVar390 + fVar334 * fVar364;
    auVar368._8_4_ = fVar302 * fVar376 + fVar327 * fVar398 + fVar328 * fVar391 + fVar334 * fVar269;
    auVar368._12_4_ = fVar302 * fVar378 + fVar327 * fVar407 + fVar328 * fVar395 + fVar334 * fVar379;
    fVar364 = fVar310 - fVar243;
    fVar269 = fVar314 - fVar262;
    fVar389 = fVar316 - fVar265;
    fVar390 = fVar318 - fVar267;
    fVar391 = fVar294 - fVar396;
    fVar304 = fVar303 - fVar404;
    fVar307 = fVar306 - fVar409;
    fVar309 = fVar308 - fVar412;
    fVar190 = fVar396 * fVar364 - fVar243 * fVar391;
    fVar405 = fVar404 * fVar269 - fVar262 * fVar304;
    fVar410 = fVar409 * fVar389 - fVar265 * fVar307;
    fVar413 = fVar412 * fVar390 - fVar267 * fVar309;
    auVar144 = maxps(auVar286,auVar368);
    bVar89 = fVar190 * fVar190 <=
             auVar144._0_4_ * auVar144._0_4_ * (fVar364 * fVar364 + fVar391 * fVar391) &&
             0.0 < fVar224;
    auVar402._0_4_ = -(uint)bVar89;
    bVar90 = fVar405 * fVar405 <=
             auVar144._4_4_ * auVar144._4_4_ * (fVar269 * fVar269 + fVar304 * fVar304) &&
             1.0 < fVar224;
    auVar402._4_4_ = -(uint)bVar90;
    bVar88 = fVar410 * fVar410 <=
             auVar144._8_4_ * auVar144._8_4_ * (fVar389 * fVar389 + fVar307 * fVar307) &&
             2.0 < fVar224;
    auVar402._8_4_ = -(uint)bVar88;
    bVar87 = 3.0 < fVar224 &&
             fVar413 * fVar413 <=
             auVar144._12_4_ * auVar144._12_4_ * (fVar390 * fVar390 + fVar309 * fVar309);
    auVar402._12_4_ = -(uint)bVar87;
    local_478 = (float)uVar187;
    local_478 = local_478 * 4.7683716e-07;
    iVar181 = movmskps((int)(pre->ray_space + k),auVar402);
    fVar190 = *(float *)(ray + k * 4 + 0x30);
    _local_3c8 = ZEXT416((uint)fVar190);
    local_410 = pRVar105;
    fStack_3ec = fVar328;
    fStack_3dc = fVar327;
    fStack_3cc = fVar334;
    if (iVar181 != 0) {
      local_378 = auVar68._0_4_;
      fStack_374 = auVar68._4_4_;
      fStack_370 = auVar68._8_4_;
      local_518._0_4_ = auVar66._0_4_;
      stack0xfffffffffffffaec = auVar66._4_4_;
      fStack_510 = auVar66._8_4_;
      fVar122 = (float)local_518._0_4_ * fVar218 + local_378 * fVar280 + fVar403 * fVar374 +
                fVar366 * fVar360;
      fVar184 = stack0xfffffffffffffaec * fVar218 + fStack_374 * fVar280 + fVar408 * fVar374 +
                fVar373 * fVar360;
      fVar186 = fStack_510 * fVar218 + fStack_370 * fVar280 + fVar398 * fVar374 + fVar376 * fVar360;
      fVar188 = fVar379 * fVar218 + fVar395 * fVar280 + fVar407 * fVar374 + fVar378 * fVar360;
      local_358 = auVar64._0_4_;
      fStack_354 = auVar64._4_4_;
      fStack_350 = auVar64._8_4_;
      fVar244 = local_358 * fVar218 + fVar240 * fVar280 + fVar292 * fVar374 + fVar365 * fVar360;
      fVar263 = fStack_354 * fVar218 + fVar241 * fVar280 + fVar293 * fVar374 + fVar372 * fVar360;
      fVar266 = fStack_350 * fVar218 + fVar242 * fVar280 + fVar335 * fVar374 + fVar375 * fVar360;
      fVar268 = fVar278 * fVar218 + fVar264 * fVar280 + fVar336 * fVar374 + fVar377 * fVar360;
      fVar240 = *(float *)(bezier_basis0 + lVar110 + 0x1210);
      fVar241 = *(float *)(bezier_basis0 + lVar110 + 0x1214);
      fVar242 = *(float *)(bezier_basis0 + lVar110 + 0x1218);
      fVar264 = *(float *)(bezier_basis0 + lVar110 + 0x121c);
      fVar278 = *(float *)(bezier_basis0 + lVar110 + 0x1694);
      fVar292 = *(float *)(bezier_basis0 + lVar110 + 0x1698);
      fVar293 = *(float *)(bezier_basis0 + lVar110 + 0x169c);
      fVar335 = *(float *)(bezier_basis0 + lVar110 + 0x16a0);
      fVar336 = *(float *)(bezier_basis0 + lVar110 + 0x1b18);
      fVar365 = *(float *)(bezier_basis0 + lVar110 + 0x1b1c);
      fVar372 = *(float *)(bezier_basis0 + lVar110 + 0x1b20);
      fVar375 = *(float *)(bezier_basis0 + lVar110 + 0x1b24);
      fVar377 = *(float *)(bezier_basis0 + lVar110 + 0x1f9c);
      fVar379 = *(float *)(bezier_basis0 + lVar110 + 0x1fa0);
      fVar395 = *(float *)(bezier_basis0 + lVar110 + 0x1fa4);
      fVar403 = *(float *)(bezier_basis0 + lVar110 + 0x1fa8);
      fVar337 = fVar305 * fVar240 + fVar313 * fVar278 + fVar320 * fVar336 + fVar220 * fVar377;
      fVar347 = fVar305 * fVar241 + fVar313 * fVar292 + fVar320 * fVar365 + fVar220 * fVar379;
      fVar348 = fVar305 * fVar242 + fVar313 * fVar293 + fVar320 * fVar372 + fVar220 * fVar395;
      fVar350 = fVar305 * fVar264 + fVar313 * fVar335 + fVar320 * fVar375 + fVar220 * fVar403;
      fVar397 = fVar371 * fVar240 + fVar346 * fVar278 + fVar326 * fVar336 + fVar225 * fVar377;
      fVar406 = fVar371 * fVar241 + fVar346 * fVar292 + fVar326 * fVar365 + fVar225 * fVar379;
      fVar411 = fVar371 * fVar242 + fVar346 * fVar293 + fVar326 * fVar372 + fVar225 * fVar395;
      fVar414 = fVar371 * fVar264 + fVar346 * fVar335 + fVar326 * fVar375 + fVar225 * fVar403;
      fVar408 = *(float *)(bezier_basis1 + lVar110 + 0x1210);
      fVar398 = *(float *)(bezier_basis1 + lVar110 + 0x1214);
      fVar407 = *(float *)(bezier_basis1 + lVar110 + 0x1218);
      fVar366 = *(float *)(bezier_basis1 + lVar110 + 0x121c);
      fVar373 = *(float *)(bezier_basis1 + lVar110 + 0x1b18);
      fVar376 = *(float *)(bezier_basis1 + lVar110 + 0x1b1c);
      fVar378 = *(float *)(bezier_basis1 + lVar110 + 0x1b20);
      fVar405 = *(float *)(bezier_basis1 + lVar110 + 0x1b24);
      fVar410 = *(float *)(bezier_basis1 + lVar110 + 0x1f9c);
      fVar413 = *(float *)(bezier_basis1 + lVar110 + 0x1fa0);
      fVar349 = *(float *)(bezier_basis1 + lVar110 + 0x1fa4);
      fVar351 = *(float *)(bezier_basis1 + lVar110 + 0x1fa8);
      auVar271._0_4_ = fVar225 * fVar410;
      auVar271._4_4_ = fVar225 * fVar413;
      auVar271._8_4_ = fVar225 * fVar349;
      auVar271._12_4_ = fVar225 * fVar351;
      fVar352 = *(float *)(bezier_basis1 + lVar110 + 0x1694);
      fVar361 = *(float *)(bezier_basis1 + lVar110 + 0x1698);
      fVar362 = *(float *)(bezier_basis1 + lVar110 + 0x169c);
      fVar363 = *(float *)(bezier_basis1 + lVar110 + 0x16a0);
      fVar311 = fVar305 * fVar408 + fVar313 * fVar352 + fVar320 * fVar373 + fVar220 * fVar410;
      fVar315 = fVar305 * fVar398 + fVar313 * fVar361 + fVar320 * fVar376 + fVar220 * fVar413;
      fVar317 = fVar305 * fVar407 + fVar313 * fVar362 + fVar320 * fVar378 + fVar220 * fVar349;
      fVar319 = fVar305 * fVar366 + fVar313 * fVar363 + fVar320 * fVar405 + fVar220 * fVar351;
      fVar191 = fVar371 * fVar408 + fVar346 * fVar352 + fVar326 * fVar373 + auVar271._0_4_;
      fVar219 = fVar371 * fVar398 + fVar346 * fVar361 + fVar326 * fVar376 + auVar271._4_4_;
      fVar221 = fVar371 * fVar407 + fVar346 * fVar362 + fVar326 * fVar378 + auVar271._8_4_;
      fVar222 = fVar371 * fVar366 + fVar346 * fVar363 + fVar326 * fVar405 + auVar271._12_4_;
      auVar369._0_8_ = CONCAT44(fVar347,fVar337) & 0x7fffffff7fffffff;
      auVar369._8_4_ = ABS(fVar348);
      auVar369._12_4_ = ABS(fVar350);
      auVar324._0_8_ = CONCAT44(fVar406,fVar397) & 0x7fffffff7fffffff;
      auVar324._8_4_ = ABS(fVar411);
      auVar324._12_4_ = ABS(fVar414);
      auVar144 = maxps(auVar369,auVar324);
      auVar385._0_8_ =
           CONCAT44(fVar241 * fVar360 + fVar292 * fVar374 + fVar365 * fVar280 + fVar379 * fVar218,
                    fVar240 * fVar360 + fVar278 * fVar374 + fVar336 * fVar280 + fVar377 * fVar218) &
           0x7fffffff7fffffff;
      auVar385._8_4_ =
           ABS(fVar242 * fVar360 + fVar293 * fVar374 + fVar372 * fVar280 + fVar395 * fVar218);
      auVar385._12_4_ =
           ABS(fVar264 * fVar360 + fVar335 * fVar374 + fVar375 * fVar280 + fVar403 * fVar218);
      auVar144 = maxps(auVar144,auVar385);
      uVar115 = -(uint)(local_478 <= auVar144._0_4_);
      uVar117 = -(uint)(local_478 <= auVar144._4_4_);
      uVar116 = -(uint)(local_478 <= auVar144._8_4_);
      uVar118 = -(uint)(local_478 <= auVar144._12_4_);
      fVar292 = (float)((uint)fVar337 & uVar115 | ~uVar115 & (uint)fVar364);
      fVar372 = (float)((uint)fVar347 & uVar117 | ~uVar117 & (uint)fVar269);
      fVar375 = (float)((uint)fVar348 & uVar116 | ~uVar116 & (uint)fVar389);
      fVar377 = (float)((uint)fVar350 & uVar118 | ~uVar118 & (uint)fVar390);
      fVar379 = (float)(~uVar115 & (uint)fVar391 | (uint)fVar397 & uVar115);
      fVar395 = (float)(~uVar117 & (uint)fVar304 | (uint)fVar406 & uVar117);
      fVar403 = (float)(~uVar116 & (uint)fVar307 | (uint)fVar411 & uVar116);
      fVar337 = (float)(~uVar118 & (uint)fVar309 | (uint)fVar414 & uVar118);
      auVar386._0_8_ = CONCAT44(fVar315,fVar311) & 0x7fffffff7fffffff;
      auVar386._8_4_ = ABS(fVar317);
      auVar386._12_4_ = ABS(fVar319);
      auVar333._0_8_ = CONCAT44(fVar219,fVar191) & 0x7fffffff7fffffff;
      auVar333._8_4_ = ABS(fVar221);
      auVar333._12_4_ = ABS(fVar222);
      auVar144 = maxps(auVar386,auVar333);
      auVar300._0_8_ =
           CONCAT44(fVar398 * fVar360 + fVar361 * fVar374 + fVar376 * fVar280 + fVar413 * fVar218,
                    fVar408 * fVar360 + fVar352 * fVar374 + fVar373 * fVar280 + fVar410 * fVar218) &
           0x7fffffff7fffffff;
      auVar300._8_4_ =
           ABS(fVar407 * fVar360 + fVar362 * fVar374 + fVar378 * fVar280 + fVar349 * fVar218);
      auVar300._12_4_ =
           ABS(fVar366 * fVar360 + fVar363 * fVar374 + fVar405 * fVar280 + fVar351 * fVar218);
      auVar144 = maxps(auVar144,auVar300);
      uVar115 = -(uint)(local_478 <= auVar144._0_4_);
      uVar117 = -(uint)(local_478 <= auVar144._4_4_);
      uVar116 = -(uint)(local_478 <= auVar144._8_4_);
      uVar118 = -(uint)(local_478 <= auVar144._12_4_);
      fVar364 = (float)((uint)fVar311 & uVar115 | ~uVar115 & (uint)fVar364);
      fVar278 = (float)((uint)fVar315 & uVar117 | ~uVar117 & (uint)fVar269);
      fVar293 = (float)((uint)fVar317 & uVar116 | ~uVar116 & (uint)fVar389);
      fVar335 = (float)((uint)fVar319 & uVar118 | ~uVar118 & (uint)fVar390);
      fVar389 = (float)(~uVar115 & (uint)fVar391 | (uint)fVar191 & uVar115);
      fVar390 = (float)(~uVar117 & (uint)fVar304 | (uint)fVar219 & uVar117);
      fVar391 = (float)(~uVar116 & (uint)fVar307 | (uint)fVar221 & uVar116);
      fVar408 = (float)(~uVar118 & (uint)fVar309 | (uint)fVar222 & uVar118);
      auVar197._0_4_ = fVar379 * fVar379 + fVar292 * fVar292;
      auVar197._4_4_ = fVar395 * fVar395 + fVar372 * fVar372;
      auVar197._8_4_ = fVar403 * fVar403 + fVar375 * fVar375;
      auVar197._12_4_ = fVar337 * fVar337 + fVar377 * fVar377;
      auVar144 = rsqrtps(auVar271,auVar197);
      fVar240 = auVar144._0_4_;
      fVar241 = auVar144._4_4_;
      fVar242 = auVar144._8_4_;
      fVar264 = auVar144._12_4_;
      auVar272._0_4_ = fVar240 * fVar240 * auVar197._0_4_ * 0.5 * fVar240;
      auVar272._4_4_ = fVar241 * fVar241 * auVar197._4_4_ * 0.5 * fVar241;
      auVar272._8_4_ = fVar242 * fVar242 * auVar197._8_4_ * 0.5 * fVar242;
      auVar272._12_4_ = fVar264 * fVar264 * auVar197._12_4_ * 0.5 * fVar264;
      fVar398 = fVar240 * 1.5 - auVar272._0_4_;
      fVar407 = fVar241 * 1.5 - auVar272._4_4_;
      fVar304 = fVar242 * 1.5 - auVar272._8_4_;
      fVar307 = fVar264 * 1.5 - auVar272._12_4_;
      auVar198._0_4_ = fVar389 * fVar389 + fVar364 * fVar364;
      auVar198._4_4_ = fVar390 * fVar390 + fVar278 * fVar278;
      auVar198._8_4_ = fVar391 * fVar391 + fVar293 * fVar293;
      auVar198._12_4_ = fVar408 * fVar408 + fVar335 * fVar335;
      auVar144 = rsqrtps(auVar272,auVar198);
      fVar240 = auVar144._0_4_;
      fVar241 = auVar144._4_4_;
      fVar242 = auVar144._8_4_;
      fVar264 = auVar144._12_4_;
      fVar240 = fVar240 * 1.5 - fVar240 * fVar240 * auVar198._0_4_ * 0.5 * fVar240;
      fVar336 = fVar241 * 1.5 - fVar241 * fVar241 * auVar198._4_4_ * 0.5 * fVar241;
      fVar242 = fVar242 * 1.5 - fVar242 * fVar242 * auVar198._8_4_ * 0.5 * fVar242;
      fVar365 = fVar264 * 1.5 - fVar264 * fVar264 * auVar198._12_4_ * 0.5 * fVar264;
      fVar366 = fVar379 * fVar398 * auVar286._0_4_;
      fVar373 = fVar395 * fVar407 * auVar286._4_4_;
      fVar376 = fVar403 * fVar304 * auVar286._8_4_;
      fVar378 = fVar337 * fVar307 * auVar286._12_4_;
      fVar241 = -fVar292 * fVar398 * auVar286._0_4_;
      fVar264 = -fVar372 * fVar407 * auVar286._4_4_;
      fVar269 = -fVar375 * fVar304 * auVar286._8_4_;
      fVar292 = -fVar377 * fVar307 * auVar286._12_4_;
      fVar337 = fVar398 * 0.0 * auVar286._0_4_;
      fVar347 = fVar407 * 0.0 * auVar286._4_4_;
      fVar348 = fVar304 * 0.0 * auVar286._8_4_;
      fVar350 = fVar307 * 0.0 * auVar286._12_4_;
      fVar311 = fVar389 * fVar240 * auVar368._0_4_;
      fVar315 = fVar390 * fVar336 * auVar368._4_4_;
      fVar317 = fVar391 * fVar242 * auVar368._8_4_;
      fVar319 = fVar408 * fVar365 * auVar368._12_4_;
      fVar410 = fVar310 + fVar311;
      fVar413 = fVar314 + fVar315;
      fVar349 = fVar316 + fVar317;
      fVar351 = fVar318 + fVar319;
      fVar403 = -fVar364 * fVar240 * auVar368._0_4_;
      fVar408 = -fVar278 * fVar336 * auVar368._4_4_;
      fVar398 = -fVar293 * fVar242 * auVar368._8_4_;
      fVar407 = -fVar335 * fVar365 * auVar368._12_4_;
      fVar352 = fVar294 + fVar403;
      fVar361 = fVar303 + fVar408;
      fVar362 = fVar306 + fVar398;
      fVar363 = fVar308 + fVar407;
      fVar375 = fVar240 * 0.0 * auVar368._0_4_;
      fVar379 = fVar336 * 0.0 * auVar368._4_4_;
      fVar390 = fVar242 * 0.0 * auVar368._8_4_;
      fVar395 = fVar365 * 0.0 * auVar368._12_4_;
      fVar304 = fVar243 - fVar366;
      fVar307 = fVar262 - fVar373;
      fVar309 = fVar265 - fVar376;
      fVar405 = fVar267 - fVar378;
      fVar191 = fVar122 + fVar375;
      fVar219 = fVar184 + fVar379;
      fVar221 = fVar186 + fVar390;
      fVar222 = fVar188 + fVar395;
      fVar240 = fVar396 - fVar241;
      fVar242 = fVar404 - fVar264;
      fVar364 = fVar409 - fVar269;
      fVar278 = fVar412 - fVar292;
      fVar372 = fVar244 - fVar337;
      fVar377 = fVar263 - fVar347;
      fVar389 = fVar266 - fVar348;
      fVar391 = fVar268 - fVar350;
      uVar115 = -(uint)(0.0 < (fVar240 * (fVar191 - fVar372) - fVar372 * (fVar352 - fVar240)) * 0.0
                              + (fVar372 * (fVar410 - fVar304) - (fVar191 - fVar372) * fVar304) *
                                0.0 + ((fVar352 - fVar240) * fVar304 - (fVar410 - fVar304) * fVar240
                                      ));
      uVar117 = -(uint)(0.0 < (fVar242 * (fVar219 - fVar377) - fVar377 * (fVar361 - fVar242)) * 0.0
                              + (fVar377 * (fVar413 - fVar307) - (fVar219 - fVar377) * fVar307) *
                                0.0 + ((fVar361 - fVar242) * fVar307 - (fVar413 - fVar307) * fVar242
                                      ));
      uVar116 = -(uint)(0.0 < (fVar364 * (fVar221 - fVar389) - fVar389 * (fVar362 - fVar364)) * 0.0
                              + (fVar389 * (fVar349 - fVar309) - (fVar221 - fVar389) * fVar309) *
                                0.0 + ((fVar362 - fVar364) * fVar309 - (fVar349 - fVar309) * fVar364
                                      ));
      uVar118 = -(uint)(0.0 < (fVar278 * (fVar222 - fVar391) - fVar391 * (fVar363 - fVar278)) * 0.0
                              + (fVar391 * (fVar351 - fVar405) - (fVar222 - fVar391) * fVar405) *
                                0.0 + ((fVar363 - fVar278) * fVar405 - (fVar351 - fVar405) * fVar278
                                      ));
      fVar366 = (float)((uint)(fVar310 - fVar311) & uVar115 | ~uVar115 & (uint)(fVar243 + fVar366));
      fVar373 = (float)((uint)(fVar314 - fVar315) & uVar117 | ~uVar117 & (uint)(fVar262 + fVar373));
      fVar376 = (float)((uint)(fVar316 - fVar317) & uVar116 | ~uVar116 & (uint)(fVar265 + fVar376));
      fVar378 = (float)((uint)(fVar318 - fVar319) & uVar118 | ~uVar118 & (uint)(fVar267 + fVar378));
      fVar293 = (float)((uint)(fVar294 - fVar403) & uVar115 | ~uVar115 & (uint)(fVar396 + fVar241));
      fVar335 = (float)((uint)(fVar303 - fVar408) & uVar117 | ~uVar117 & (uint)(fVar404 + fVar264));
      fVar336 = (float)((uint)(fVar306 - fVar398) & uVar116 | ~uVar116 & (uint)(fVar409 + fVar269));
      fVar365 = (float)((uint)(fVar308 - fVar407) & uVar118 | ~uVar118 & (uint)(fVar412 + fVar292));
      fVar403 = (float)((uint)(fVar122 - fVar375) & uVar115 | ~uVar115 & (uint)(fVar244 + fVar337));
      fVar408 = (float)((uint)(fVar184 - fVar379) & uVar117 | ~uVar117 & (uint)(fVar263 + fVar347));
      fVar398 = (float)((uint)(fVar186 - fVar390) & uVar116 | ~uVar116 & (uint)(fVar266 + fVar348));
      fVar407 = (float)((uint)(fVar188 - fVar395) & uVar118 | ~uVar118 & (uint)(fVar268 + fVar350));
      fVar243 = (float)((uint)fVar304 & uVar115 | ~uVar115 & (uint)fVar410);
      fVar262 = (float)((uint)fVar307 & uVar117 | ~uVar117 & (uint)fVar413);
      fVar265 = (float)((uint)fVar309 & uVar116 | ~uVar116 & (uint)fVar349);
      fVar267 = (float)((uint)fVar405 & uVar118 | ~uVar118 & (uint)fVar351);
      fVar241 = (float)((uint)fVar240 & uVar115 | ~uVar115 & (uint)fVar352);
      fVar264 = (float)((uint)fVar242 & uVar117 | ~uVar117 & (uint)fVar361);
      fVar269 = (float)((uint)fVar364 & uVar116 | ~uVar116 & (uint)fVar362);
      fVar292 = (float)((uint)fVar278 & uVar118 | ~uVar118 & (uint)fVar363);
      fVar375 = (float)((uint)fVar372 & uVar115 | ~uVar115 & (uint)fVar191);
      fVar379 = (float)((uint)fVar377 & uVar117 | ~uVar117 & (uint)fVar219);
      fVar390 = (float)((uint)fVar389 & uVar116 | ~uVar116 & (uint)fVar221);
      fVar395 = (float)((uint)fVar391 & uVar118 | ~uVar118 & (uint)fVar222);
      fVar294 = (float)((uint)fVar410 & uVar115 | ~uVar115 & (uint)fVar304) - fVar366;
      fVar303 = (float)((uint)fVar413 & uVar117 | ~uVar117 & (uint)fVar307) - fVar373;
      fVar304 = (float)((uint)fVar349 & uVar116 | ~uVar116 & (uint)fVar309) - fVar376;
      fVar306 = (float)((uint)fVar351 & uVar118 | ~uVar118 & (uint)fVar405) - fVar378;
      fVar307 = (float)((uint)fVar352 & uVar115 | ~uVar115 & (uint)fVar240) - fVar293;
      fVar308 = (float)((uint)fVar361 & uVar117 | ~uVar117 & (uint)fVar242) - fVar335;
      fVar309 = (float)((uint)fVar362 & uVar116 | ~uVar116 & (uint)fVar364) - fVar336;
      fVar310 = (float)((uint)fVar363 & uVar118 | ~uVar118 & (uint)fVar278) - fVar365;
      fVar314 = (float)((uint)fVar191 & uVar115 | ~uVar115 & (uint)fVar372) - fVar403;
      fVar316 = (float)((uint)fVar219 & uVar117 | ~uVar117 & (uint)fVar377) - fVar408;
      fVar318 = (float)((uint)fVar221 & uVar116 | ~uVar116 & (uint)fVar389) - fVar398;
      fVar396 = (float)((uint)fVar222 & uVar118 | ~uVar118 & (uint)fVar391) - fVar407;
      fVar412 = fVar366 - fVar243;
      fVar413 = fVar373 - fVar262;
      fVar349 = fVar376 - fVar265;
      fVar351 = fVar378 - fVar267;
      fVar372 = fVar293 - fVar241;
      fVar377 = fVar335 - fVar264;
      fVar389 = fVar336 - fVar269;
      fVar391 = fVar365 - fVar292;
      fVar240 = fVar403 - fVar375;
      fVar242 = fVar408 - fVar379;
      fVar364 = fVar398 - fVar390;
      fVar278 = fVar407 - fVar395;
      fVar404 = (fVar293 * fVar314 - fVar403 * fVar307) * 0.0 +
                (fVar403 * fVar294 - fVar366 * fVar314) * 0.0 +
                (fVar366 * fVar307 - fVar293 * fVar294);
      fVar405 = (fVar335 * fVar316 - fVar408 * fVar308) * 0.0 +
                (fVar408 * fVar303 - fVar373 * fVar316) * 0.0 +
                (fVar373 * fVar308 - fVar335 * fVar303);
      auVar252._4_4_ = fVar405;
      auVar252._0_4_ = fVar404;
      fVar409 = (fVar336 * fVar318 - fVar398 * fVar309) * 0.0 +
                (fVar398 * fVar304 - fVar376 * fVar318) * 0.0 +
                (fVar376 * fVar309 - fVar336 * fVar304);
      fVar410 = (fVar365 * fVar396 - fVar407 * fVar310) * 0.0 +
                (fVar407 * fVar306 - fVar378 * fVar396) * 0.0 +
                (fVar378 * fVar310 - fVar365 * fVar306);
      auVar392._0_4_ =
           (fVar241 * fVar240 - fVar375 * fVar372) * 0.0 +
           (fVar375 * fVar412 - fVar243 * fVar240) * 0.0 + (fVar243 * fVar372 - fVar241 * fVar412);
      auVar392._4_4_ =
           (fVar264 * fVar242 - fVar379 * fVar377) * 0.0 +
           (fVar379 * fVar413 - fVar262 * fVar242) * 0.0 + (fVar262 * fVar377 - fVar264 * fVar413);
      auVar392._8_4_ =
           (fVar269 * fVar364 - fVar390 * fVar389) * 0.0 +
           (fVar390 * fVar349 - fVar265 * fVar364) * 0.0 + (fVar265 * fVar389 - fVar269 * fVar349);
      auVar392._12_4_ =
           (fVar292 * fVar278 - fVar395 * fVar391) * 0.0 +
           (fVar395 * fVar351 - fVar267 * fVar278) * 0.0 + (fVar267 * fVar391 - fVar292 * fVar351);
      auVar252._8_4_ = fVar409;
      auVar252._12_4_ = fVar410;
      auVar144 = maxps(auVar252,auVar392);
      bVar89 = auVar144._0_4_ <= 0.0 && bVar89;
      auVar253._0_4_ = -(uint)bVar89;
      bVar90 = auVar144._4_4_ <= 0.0 && bVar90;
      auVar253._4_4_ = -(uint)bVar90;
      bVar88 = auVar144._8_4_ <= 0.0 && bVar88;
      auVar253._8_4_ = -(uint)bVar88;
      bVar87 = auVar144._12_4_ <= 0.0 && bVar87;
      auVar253._12_4_ = -(uint)bVar87;
      iVar181 = movmskps(iVar181,auVar253);
      if (iVar181 == 0) {
        auVar254._8_8_ = uStack_400;
        auVar254._0_8_ = local_408;
        iVar181 = 0;
      }
      else {
        auVar273._0_4_ = fVar240 * fVar307;
        auVar273._4_4_ = fVar242 * fVar308;
        auVar273._8_4_ = fVar364 * fVar309;
        auVar273._12_4_ = fVar278 * fVar310;
        fVar375 = fVar372 * fVar314 - auVar273._0_4_;
        fVar379 = fVar377 * fVar316 - auVar273._4_4_;
        fVar390 = fVar389 * fVar318 - auVar273._8_4_;
        fVar395 = fVar391 * fVar396 - auVar273._12_4_;
        fVar240 = fVar240 * fVar294 - fVar314 * fVar412;
        fVar242 = fVar242 * fVar303 - fVar316 * fVar413;
        fVar364 = fVar364 * fVar304 - fVar318 * fVar349;
        fVar278 = fVar278 * fVar306 - fVar396 * fVar351;
        fVar372 = fVar412 * fVar307 - fVar372 * fVar294;
        fVar377 = fVar413 * fVar308 - fVar377 * fVar303;
        fVar389 = fVar349 * fVar309 - fVar389 * fVar304;
        fVar391 = fVar351 * fVar310 - fVar391 * fVar306;
        auVar287._0_4_ = fVar375 * 0.0 + fVar240 * 0.0 + fVar372;
        auVar287._4_4_ = fVar379 * 0.0 + fVar242 * 0.0 + fVar377;
        auVar287._8_4_ = fVar390 * 0.0 + fVar364 * 0.0 + fVar389;
        auVar287._12_4_ = fVar395 * 0.0 + fVar278 * 0.0 + fVar391;
        auVar144 = rcpps(auVar273,auVar287);
        fVar241 = auVar144._0_4_;
        fVar264 = auVar144._4_4_;
        fVar269 = auVar144._8_4_;
        fVar292 = auVar144._12_4_;
        fVar241 = (1.0 - auVar287._0_4_ * fVar241) * fVar241 + fVar241;
        fVar264 = (1.0 - auVar287._4_4_ * fVar264) * fVar264 + fVar264;
        fVar269 = (1.0 - auVar287._8_4_ * fVar269) * fVar269 + fVar269;
        fVar292 = (1.0 - auVar287._12_4_ * fVar292) * fVar292 + fVar292;
        fVar293 = (fVar403 * fVar372 + fVar293 * fVar240 + fVar366 * fVar375) * fVar241;
        fVar242 = (fVar408 * fVar377 + fVar335 * fVar242 + fVar373 * fVar379) * fVar264;
        aVar345.v[1] = fVar242;
        aVar345.v[0] = fVar293;
        fVar364 = (fVar398 * fVar389 + fVar336 * fVar364 + fVar376 * fVar390) * fVar269;
        fVar278 = (fVar407 * fVar391 + fVar365 * fVar278 + fVar378 * fVar395) * fVar292;
        fVar240 = *(float *)(ray + k * 4 + 0x80);
        bVar89 = (fVar293 <= fVar240 && fVar190 <= fVar293) && bVar89;
        auVar169._0_4_ = -(uint)bVar89;
        bVar90 = (fVar242 <= fVar240 && fVar190 <= fVar242) && bVar90;
        auVar169._4_4_ = -(uint)bVar90;
        bVar88 = (fVar364 <= fVar240 && fVar190 <= fVar364) && bVar88;
        auVar169._8_4_ = -(uint)bVar88;
        bVar87 = (fVar278 <= fVar240 && fVar190 <= fVar278) && bVar87;
        auVar169._12_4_ = -(uint)bVar87;
        iVar181 = movmskps(iVar181,auVar169);
        if (iVar181 == 0) {
          auVar254._8_8_ = uStack_400;
          auVar254._0_8_ = local_408;
          iVar181 = 0;
        }
        else {
          auVar170._0_8_ =
               CONCAT44(-(uint)(auVar287._4_4_ != 0.0 && bVar90),
                        -(uint)(auVar287._0_4_ != 0.0 && bVar89));
          auVar170._8_4_ = -(uint)(auVar287._8_4_ != 0.0 && bVar88);
          auVar170._12_4_ = -(uint)(auVar287._12_4_ != 0.0 && bVar87);
          iVar181 = movmskps(iVar181,auVar170);
          auVar254._8_8_ = uStack_400;
          auVar254._0_8_ = local_408;
          if (iVar181 != 0) {
            fVar404 = fVar404 * fVar241;
            fVar405 = fVar405 * fVar264;
            fVar409 = fVar409 * fVar269;
            fVar410 = fVar410 * fVar292;
            auVar199._0_4_ = ~uVar115 & (uint)fVar404;
            auVar199._4_4_ = ~uVar117 & (uint)fVar405;
            auVar199._8_4_ = ~uVar116 & (uint)fVar409;
            auVar199._12_4_ = ~uVar118 & (uint)fVar410;
            auVar358._0_4_ = (uint)(1.0 - fVar404) & uVar115;
            auVar358._4_4_ = (uint)(1.0 - fVar405) & uVar117;
            auVar358._8_4_ = (uint)(1.0 - fVar409) & uVar116;
            auVar358._12_4_ = (uint)(1.0 - fVar410) & uVar118;
            aVar357 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar358 | auVar199);
            local_288 = (float)(~uVar115 & (uint)(auVar392._0_4_ * fVar241) |
                               (uint)(1.0 - auVar392._0_4_ * fVar241) & uVar115);
            fStack_284 = (float)(~uVar117 & (uint)(auVar392._4_4_ * fVar264) |
                                (uint)(1.0 - auVar392._4_4_ * fVar264) & uVar117);
            fStack_280 = (float)(~uVar116 & (uint)(auVar392._8_4_ * fVar269) |
                                (uint)(1.0 - auVar392._8_4_ * fVar269) & uVar116);
            fStack_27c = (float)(~uVar118 & (uint)(auVar392._12_4_ * fVar292) |
                                (uint)(1.0 - auVar392._12_4_ * fVar292) & uVar118);
            auVar254._8_4_ = auVar170._8_4_;
            auVar254._0_8_ = auVar170._0_8_;
            auVar254._12_4_ = auVar170._12_4_;
            aVar345.v[2] = fVar364;
            aVar345.v[3] = fVar278;
            aVar341 = aVar345;
          }
        }
      }
      iVar181 = movmskps(iVar181,auVar254);
      if (iVar181 != 0) {
        fVar240 = (auVar368._0_4_ - auVar286._0_4_) * aVar357.v[0] + auVar286._0_4_;
        fVar241 = (auVar368._4_4_ - auVar286._4_4_) * aVar357.v[1] + auVar286._4_4_;
        fVar242 = (auVar368._8_4_ - auVar286._8_4_) * aVar357.v[2] + auVar286._8_4_;
        fVar264 = (auVar368._12_4_ - auVar286._12_4_) * aVar357.v[3] + auVar286._12_4_;
        fVar190 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
        fVar364 = aVar341.v[0];
        fVar269 = aVar341.v[1];
        fVar278 = aVar341.v[2];
        fVar292 = aVar341.v[3];
        aVar171._0_4_ = -(uint)(fVar190 * (fVar240 + fVar240) < fVar364) & auVar254._0_4_;
        aVar171._4_4_ = -(uint)(fVar190 * (fVar241 + fVar241) < fVar269) & auVar254._4_4_;
        aVar171._8_4_ = -(uint)(fVar190 * (fVar242 + fVar242) < fVar278) & auVar254._8_4_;
        aVar171._12_4_ = -(uint)(fVar190 * (fVar264 + fVar264) < fVar292) & auVar254._12_4_;
        iVar181 = movmskps((int)pre,(undefined1  [16])aVar171);
        if (iVar181 != 0) {
          local_288 = local_288 + local_288 + -1.0;
          fStack_284 = fStack_284 + fStack_284 + -1.0;
          fStack_280 = fStack_280 + fStack_280 + -1.0;
          fStack_27c = fStack_27c + fStack_27c + -1.0;
          bhit.i = 0;
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v0.field_0._0_8_ =
               CONCAT44(fVar291,fVar279);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v0.field_0._8_8_ =
               CONCAT44(fVar302,fVar189);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v1.field_0._0_8_ =
               CONCAT44(fStack_3e4,local_3e8);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v1.field_0._8_8_ =
               CONCAT44(fVar327,fStack_3e0);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v2.field_0._0_8_ =
               CONCAT44(fStack_3f4,local_3f8);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v2.field_0._8_8_ =
               CONCAT44(fVar328,fStack_3f0);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v3.field_0._0_8_ =
               CONCAT44(fStack_3d4,local_3d8);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v3.field_0._8_8_ =
               CONCAT44(fVar334,fStack_3d0);
          bhit.U.field_0 = aVar357;
          bhit.V.field_0.v[0] = local_288;
          bhit.V.field_0.v[1] = fStack_284;
          bhit.V.field_0.v[2] = fStack_280;
          bhit.V.field_0.v[3] = fStack_27c;
          bhit.T.field_0 = aVar341;
          bhit.N = iVar121;
          bhit.valid.field_0 = aVar171;
          if ((pGVar27->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            fVar190 = 1.0 / fVar224;
            bhit.vu.field_0.v[0] = fVar190 * (aVar357.v[0] + 0.0);
            bhit.vu.field_0.v[1] = fVar190 * (aVar357.v[1] + 1.0);
            bhit.vu.field_0.v[2] = fVar190 * (aVar357.v[2] + 2.0);
            bhit.vu.field_0.v[3] = fVar190 * (aVar357.v[3] + 3.0);
            bhit.vv.field_0._0_8_ = CONCAT44(fStack_284,local_288);
            bhit.vv.field_0._8_8_ = CONCAT44(fStack_27c,fStack_280);
            bhit.vt.field_0 = aVar341;
            auVar200._0_4_ = aVar171._0_4_ & (uint)fVar364;
            auVar200._4_4_ = aVar171._4_4_ & (uint)fVar269;
            auVar200._8_4_ = aVar171._8_4_ & (uint)fVar278;
            auVar200._12_4_ = aVar171._12_4_ & (uint)fVar292;
            auVar232._0_8_ = CONCAT44(~aVar171._4_4_,~aVar171._0_4_) & 0x7f8000007f800000;
            auVar232._8_4_ = ~aVar171._8_4_ & 0x7f800000;
            auVar232._12_4_ = ~aVar171._12_4_ & 0x7f800000;
            auVar232 = auVar232 | auVar200;
            auVar255._4_4_ = auVar232._0_4_;
            auVar255._0_4_ = auVar232._4_4_;
            auVar255._8_4_ = auVar232._12_4_;
            auVar255._12_4_ = auVar232._8_4_;
            auVar144 = minps(auVar255,auVar232);
            auVar201._0_8_ = auVar144._8_8_;
            auVar201._8_4_ = auVar144._0_4_;
            auVar201._12_4_ = auVar144._4_4_;
            auVar144 = minps(auVar201,auVar144);
            auVar202._0_8_ =
                 CONCAT44(-(uint)(auVar144._4_4_ == auVar232._4_4_) & aVar171._4_4_,
                          -(uint)(auVar144._0_4_ == auVar232._0_4_) & aVar171._0_4_);
            auVar202._8_4_ = -(uint)(auVar144._8_4_ == auVar232._8_4_) & aVar171._8_4_;
            auVar202._12_4_ = -(uint)(auVar144._12_4_ == auVar232._12_4_) & aVar171._12_4_;
            iVar181 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar202);
            aVar172 = aVar171;
            if (iVar181 != 0) {
              aVar172.i[2] = auVar202._8_4_;
              aVar172._0_8_ = auVar202._0_8_;
              aVar172.i[3] = auVar202._12_4_;
            }
            uVar115 = movmskps(iVar181,(undefined1  [16])aVar172);
            lVar111 = 0;
            if (uVar115 != 0) {
              for (; (uVar115 >> lVar111 & 1) == 0; lVar111 = lVar111 + 1) {
              }
            }
            valid.field_0 = aVar171;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar27->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar190 = bhit.vu.field_0.v[lVar111];
              fVar240 = bhit.vv.field_0.v[lVar111];
              fVar241 = 1.0 - fVar190;
              fVar264 = fVar190 * fVar241 + fVar190 * fVar241;
              fVar242 = fVar241 * fVar241 * -3.0;
              fVar364 = (fVar241 * fVar241 - fVar264) * 3.0;
              fVar241 = (fVar264 - fVar190 * fVar190) * 3.0;
              fVar264 = fVar190 * fVar190 * 3.0;
              *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[lVar111];
              *(float *)(ray + k * 4 + 0xc0) =
                   fVar242 * fVar279 +
                   fVar364 * local_3e8 + fVar241 * local_3f8 + fVar264 * local_3d8;
              *(float *)(ray + k * 4 + 0xd0) =
                   fVar242 * fVar291 +
                   fVar364 * fStack_3e4 + fVar241 * fStack_3f4 + fVar264 * fStack_3d4;
              *(float *)(ray + k * 4 + 0xe0) =
                   fVar242 * fVar189 +
                   fVar364 * fStack_3e0 + fVar241 * fStack_3f0 + fVar264 * fStack_3d0;
              *(float *)(ray + k * 4 + 0xf0) = fVar190;
              *(float *)(ray + k * 4 + 0x100) = fVar240;
              *(uint *)(ray + k * 4 + 0x110) = uVar114;
              *(uint *)(ray + k * 4 + 0x120) = (uint)uStack_2d0;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              pRVar108 = (RTCIntersectArguments *)context;
            }
            else {
              local_4a8 = CONCAT44(uVar114,uVar114);
              uStack_4a0._0_4_ = uVar114;
              uStack_4a0._4_4_ = uVar114;
              auVar144 = *(undefined1 (*) [16])(mm_lookupmask_ps + lVar107);
              _local_518 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
              while( true ) {
                local_c8 = bhit.vu.field_0.v[lVar111];
                local_b8 = bhit.vv.field_0.v[lVar111];
                *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[lVar111];
                fVar190 = 1.0 - local_c8;
                fVar241 = local_c8 * fVar190 + local_c8 * fVar190;
                fVar242 = (fVar241 - local_c8 * local_c8) * 3.0;
                fVar240 = local_c8 * local_c8 * 3.0;
                fVar241 = (fVar190 * fVar190 - fVar241) * 3.0;
                args.context = context->user;
                fVar190 = fVar190 * fVar190 * -3.0;
                local_f8 = fVar190 * fVar279 +
                           fVar241 * local_3e8 + fVar242 * local_3f8 + fVar240 * local_3d8;
                local_e8 = fVar190 * fVar291 +
                           fVar241 * fStack_3e4 + fVar242 * fStack_3f4 + fVar240 * fStack_3d4;
                local_d8 = fVar190 * fVar189 +
                           fVar241 * fStack_3e0 + fVar242 * fStack_3f0 + fVar240 * fStack_3d0;
                fStack_f4 = local_f8;
                fStack_f0 = local_f8;
                fStack_ec = local_f8;
                fStack_e4 = local_e8;
                fStack_e0 = local_e8;
                fStack_dc = local_e8;
                fStack_d4 = local_d8;
                fStack_d0 = local_d8;
                fStack_cc = local_d8;
                fStack_c4 = local_c8;
                fStack_c0 = local_c8;
                fStack_bc = local_c8;
                fStack_b4 = local_b8;
                fStack_b0 = local_b8;
                fStack_ac = local_b8;
                local_a8 = local_4a8;
                uStack_a0 = uStack_4a0;
                local_98 = CONCAT44((uint)uStack_2d0,(uint)uStack_2d0);
                uStack_90 = CONCAT44((uint)uStack_2d0,(uint)uStack_2d0);
                local_88 = (args.context)->instID[0];
                uStack_84 = local_88;
                uStack_80 = local_88;
                uStack_7c = local_88;
                local_78 = (args.context)->instPrimID[0];
                uStack_74 = local_78;
                uStack_70 = local_78;
                uStack_6c = local_78;
                args.valid = (int *)local_428;
                pRVar108 = (RTCIntersectArguments *)pGVar27->userPtr;
                args.hit = (RTCHitN *)&local_f8;
                args.N = 4;
                p_Var103 = pGVar27->intersectionFilterN;
                auVar415._8_8_ = pGVar109;
                auVar415._0_8_ = p_Var103;
                local_428 = auVar144;
                args.geometryUserPtr = pRVar108;
                args.ray = (RTCRayN *)ray;
                if (p_Var103 != (RTCFilterFunctionN)0x0) {
                  auVar415 = (*p_Var103)(&args);
                }
                pGVar109 = auVar415._8_8_;
                auVar213._0_4_ = -(uint)(local_428._0_4_ == 0);
                auVar213._4_4_ = -(uint)(local_428._4_4_ == 0);
                auVar213._8_4_ = -(uint)(local_428._8_4_ == 0);
                auVar213._12_4_ = -(uint)(local_428._12_4_ == 0);
                uVar115 = movmskps(auVar415._0_4_,auVar213);
                pRVar104 = (RTCRayN *)(ulong)(uVar115 ^ 0xf);
                if ((uVar115 ^ 0xf) == 0) {
                  auVar213 = auVar213 ^ _DAT_01f46b70;
                }
                else {
                  pRVar108 = context->args;
                  pRVar105 = (RTCIntersectArguments *)pRVar108->filter;
                  auVar99._8_8_ = pGVar109;
                  auVar99._0_8_ = pRVar105;
                  auVar416._8_8_ = pGVar109;
                  auVar416._0_8_ = pRVar105;
                  if ((pRVar105 != (RTCIntersectArguments *)0x0) &&
                     ((((ulong)*(Scene **)&pRVar108->flags & 2) != 0 ||
                      (auVar416 = auVar99, ((pGVar27->field_8).field_0x2 & 0x40) != 0)))) {
                    auVar416 = (*(code *)pRVar105)(&args);
                  }
                  pGVar109 = auVar416._8_8_;
                  auVar178._0_4_ = -(uint)(local_428._0_4_ == 0);
                  auVar178._4_4_ = -(uint)(local_428._4_4_ == 0);
                  auVar178._8_4_ = -(uint)(local_428._8_4_ == 0);
                  auVar178._12_4_ = -(uint)(local_428._12_4_ == 0);
                  auVar213 = auVar178 ^ _DAT_01f46b70;
                  uVar115 = movmskps(auVar416._0_4_,auVar178);
                  pRVar104 = (RTCRayN *)(ulong)(uVar115 ^ 0xf);
                  if ((uVar115 ^ 0xf) != 0) {
                    uVar115 = *(uint *)(args.hit + 4);
                    uVar117 = *(uint *)(args.hit + 8);
                    uVar116 = *(uint *)(args.hit + 0xc);
                    *(uint *)(args.ray + 0xc0) =
                         ~auVar178._0_4_ & *(uint *)args.hit |
                         *(uint *)(args.ray + 0xc0) & auVar178._0_4_;
                    *(uint *)(args.ray + 0xc4) =
                         ~auVar178._4_4_ & uVar115 | *(uint *)(args.ray + 0xc4) & auVar178._4_4_;
                    *(uint *)(args.ray + 200) =
                         ~auVar178._8_4_ & uVar117 | *(uint *)(args.ray + 200) & auVar178._8_4_;
                    *(uint *)(args.ray + 0xcc) =
                         ~auVar178._12_4_ & uVar116 | *(uint *)(args.ray + 0xcc) & auVar178._12_4_;
                    uVar115 = *(uint *)(args.hit + 0x14);
                    uVar117 = *(uint *)(args.hit + 0x18);
                    uVar116 = *(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0xd0) =
                         ~auVar178._0_4_ & *(uint *)(args.hit + 0x10) |
                         *(uint *)(args.ray + 0xd0) & auVar178._0_4_;
                    *(uint *)(args.ray + 0xd4) =
                         ~auVar178._4_4_ & uVar115 | *(uint *)(args.ray + 0xd4) & auVar178._4_4_;
                    *(uint *)(args.ray + 0xd8) =
                         ~auVar178._8_4_ & uVar117 | *(uint *)(args.ray + 0xd8) & auVar178._8_4_;
                    *(uint *)(args.ray + 0xdc) =
                         ~auVar178._12_4_ & uVar116 | *(uint *)(args.ray + 0xdc) & auVar178._12_4_;
                    uVar115 = *(uint *)(args.hit + 0x24);
                    uVar117 = *(uint *)(args.hit + 0x28);
                    uVar116 = *(uint *)(args.hit + 0x2c);
                    *(uint *)(args.ray + 0xe0) =
                         ~auVar178._0_4_ & *(uint *)(args.hit + 0x20) |
                         *(uint *)(args.ray + 0xe0) & auVar178._0_4_;
                    *(uint *)(args.ray + 0xe4) =
                         ~auVar178._4_4_ & uVar115 | *(uint *)(args.ray + 0xe4) & auVar178._4_4_;
                    *(uint *)(args.ray + 0xe8) =
                         ~auVar178._8_4_ & uVar117 | *(uint *)(args.ray + 0xe8) & auVar178._8_4_;
                    *(uint *)(args.ray + 0xec) =
                         ~auVar178._12_4_ & uVar116 | *(uint *)(args.ray + 0xec) & auVar178._12_4_;
                    uVar115 = *(uint *)(args.hit + 0x34);
                    uVar117 = *(uint *)(args.hit + 0x38);
                    uVar116 = *(uint *)(args.hit + 0x3c);
                    *(uint *)(args.ray + 0xf0) =
                         ~auVar178._0_4_ & *(uint *)(args.hit + 0x30) |
                         *(uint *)(args.ray + 0xf0) & auVar178._0_4_;
                    *(uint *)(args.ray + 0xf4) =
                         ~auVar178._4_4_ & uVar115 | *(uint *)(args.ray + 0xf4) & auVar178._4_4_;
                    *(uint *)(args.ray + 0xf8) =
                         ~auVar178._8_4_ & uVar117 | *(uint *)(args.ray + 0xf8) & auVar178._8_4_;
                    *(uint *)(args.ray + 0xfc) =
                         ~auVar178._12_4_ & uVar116 | *(uint *)(args.ray + 0xfc) & auVar178._12_4_;
                    uVar115 = *(uint *)(args.hit + 0x44);
                    uVar117 = *(uint *)(args.hit + 0x48);
                    uVar116 = *(uint *)(args.hit + 0x4c);
                    *(uint *)(args.ray + 0x100) =
                         ~auVar178._0_4_ & *(uint *)(args.hit + 0x40) |
                         *(uint *)(args.ray + 0x100) & auVar178._0_4_;
                    *(uint *)(args.ray + 0x104) =
                         ~auVar178._4_4_ & uVar115 | *(uint *)(args.ray + 0x104) & auVar178._4_4_;
                    *(uint *)(args.ray + 0x108) =
                         ~auVar178._8_4_ & uVar117 | *(uint *)(args.ray + 0x108) & auVar178._8_4_;
                    *(uint *)(args.ray + 0x10c) =
                         ~auVar178._12_4_ & uVar116 | *(uint *)(args.ray + 0x10c) & auVar178._12_4_;
                    uVar115 = *(uint *)(args.hit + 0x54);
                    uVar117 = *(uint *)(args.hit + 0x58);
                    uVar116 = *(uint *)(args.hit + 0x5c);
                    *(uint *)(args.ray + 0x110) =
                         *(uint *)(args.ray + 0x110) & auVar178._0_4_ |
                         ~auVar178._0_4_ & *(uint *)(args.hit + 0x50);
                    *(uint *)(args.ray + 0x114) =
                         *(uint *)(args.ray + 0x114) & auVar178._4_4_ | ~auVar178._4_4_ & uVar115;
                    *(uint *)(args.ray + 0x118) =
                         *(uint *)(args.ray + 0x118) & auVar178._8_4_ | ~auVar178._8_4_ & uVar117;
                    *(uint *)(args.ray + 0x11c) =
                         *(uint *)(args.ray + 0x11c) & auVar178._12_4_ | ~auVar178._12_4_ & uVar116;
                    uVar115 = *(uint *)(args.hit + 100);
                    uVar117 = *(uint *)(args.hit + 0x68);
                    uVar116 = *(uint *)(args.hit + 0x6c);
                    *(uint *)(args.ray + 0x120) =
                         *(uint *)(args.ray + 0x120) & auVar178._0_4_ |
                         ~auVar178._0_4_ & *(uint *)(args.hit + 0x60);
                    *(uint *)(args.ray + 0x124) =
                         *(uint *)(args.ray + 0x124) & auVar178._4_4_ | ~auVar178._4_4_ & uVar115;
                    *(uint *)(args.ray + 0x128) =
                         *(uint *)(args.ray + 0x128) & auVar178._8_4_ | ~auVar178._8_4_ & uVar117;
                    *(uint *)(args.ray + 300) =
                         *(uint *)(args.ray + 300) & auVar178._12_4_ | ~auVar178._12_4_ & uVar116;
                    uVar115 = *(uint *)(args.hit + 0x74);
                    uVar117 = *(uint *)(args.hit + 0x78);
                    uVar116 = *(uint *)(args.hit + 0x7c);
                    *(uint *)(args.ray + 0x130) =
                         ~auVar178._0_4_ & *(uint *)(args.hit + 0x70) |
                         *(uint *)(args.ray + 0x130) & auVar178._0_4_;
                    *(uint *)(args.ray + 0x134) =
                         ~auVar178._4_4_ & uVar115 | *(uint *)(args.ray + 0x134) & auVar178._4_4_;
                    *(uint *)(args.ray + 0x138) =
                         ~auVar178._8_4_ & uVar117 | *(uint *)(args.ray + 0x138) & auVar178._8_4_;
                    *(uint *)(args.ray + 0x13c) =
                         ~auVar178._12_4_ & uVar116 | *(uint *)(args.ray + 0x13c) & auVar178._12_4_;
                    *(undefined1 (*) [16])(args.ray + 0x140) =
                         ~auVar178 & *(undefined1 (*) [16])(args.hit + 0x80) |
                         *(undefined1 (*) [16])(args.ray + 0x140) & auVar178;
                    pRVar104 = args.ray;
                    pRVar108 = (RTCIntersectArguments *)args.hit;
                  }
                }
                auVar214._0_4_ = auVar213._0_4_ << 0x1f;
                auVar214._4_4_ = auVar213._4_4_ << 0x1f;
                auVar214._8_4_ = auVar213._8_4_ << 0x1f;
                auVar214._12_4_ = auVar213._12_4_ << 0x1f;
                iVar181 = movmskps((int)pRVar104,auVar214);
                if (iVar181 == 0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_518._0_4_;
                }
                else {
                  local_518._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  register0x00001244 = 0.0;
                  fStack_510 = 0.0;
                  uStack_50c = 0;
                }
                *(undefined4 *)(local_428 + lVar111 * 4 + -0x10) = 0;
                valid.field_0.i[0] = -(uint)(fVar364 <= (float)local_518._0_4_) & valid.field_0.i[0]
                ;
                valid.field_0.i[1] = -(uint)(fVar269 <= (float)local_518._0_4_) & valid.field_0.i[1]
                ;
                valid.field_0.i[2] = -(uint)(fVar278 <= (float)local_518._0_4_) & valid.field_0.i[2]
                ;
                valid.field_0.i[3] = -(uint)(fVar292 <= (float)local_518._0_4_) & valid.field_0.i[3]
                ;
                iVar181 = movmskps(iVar181,(undefined1  [16])valid.field_0);
                if (iVar181 == 0) break;
                auVar215._0_4_ = valid.field_0.i[0] & (uint)fVar364;
                auVar215._4_4_ = valid.field_0.i[1] & (uint)fVar269;
                auVar215._8_4_ = valid.field_0.i[2] & (uint)fVar278;
                auVar215._12_4_ = valid.field_0.i[3] & (uint)fVar292;
                auVar238._0_8_ =
                     CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                auVar238._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                auVar238._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                auVar238 = auVar238 | auVar215;
                auVar260._4_4_ = auVar238._0_4_;
                auVar260._0_4_ = auVar238._4_4_;
                auVar260._8_4_ = auVar238._12_4_;
                auVar260._12_4_ = auVar238._8_4_;
                auVar246 = minps(auVar260,auVar238);
                auVar216._0_8_ = auVar246._8_8_;
                auVar216._8_4_ = auVar246._0_4_;
                auVar216._12_4_ = auVar246._4_4_;
                auVar246 = minps(auVar216,auVar246);
                auVar217._0_8_ =
                     CONCAT44(-(uint)(auVar246._4_4_ == auVar238._4_4_) & valid.field_0.i[1],
                              -(uint)(auVar246._0_4_ == auVar238._0_4_) & valid.field_0.i[0]);
                auVar217._8_4_ = -(uint)(auVar246._8_4_ == auVar238._8_4_) & valid.field_0.i[2];
                auVar217._12_4_ = -(uint)(auVar246._12_4_ == auVar238._12_4_) & valid.field_0.i[3];
                iVar181 = movmskps(iVar181,auVar217);
                aVar179 = valid.field_0;
                if (iVar181 != 0) {
                  aVar179.i[2] = auVar217._8_4_;
                  aVar179._0_8_ = auVar217._0_8_;
                  aVar179.i[3] = auVar217._12_4_;
                }
                uVar100 = movmskps(iVar181,(undefined1  [16])aVar179);
                uVar106 = CONCAT44((int)((ulong)pRVar104 >> 0x20),uVar100);
                lVar111 = 0;
                if (uVar106 != 0) {
                  for (; (uVar106 >> lVar111 & 1) == 0; lVar111 = lVar111 + 1) {
                  }
                }
              }
            }
          }
        }
      }
    }
    uVar100 = SUB84(pRVar108,0);
    if (4 < iVar121) {
      local_58 = iVar121;
      iStack_54 = iVar121;
      iStack_50 = iVar121;
      iStack_4c = iVar121;
      local_3c8._4_4_ = local_3c8._0_4_;
      fStack_3c0 = (float)local_3c8._0_4_;
      fStack_3bc = (float)local_3c8._0_4_;
      local_68 = 1.0 / fVar224;
      fStack_64 = local_68;
      fStack_60 = local_68;
      fStack_5c = local_68;
      local_2d8 = CONCAT44((uint)uStack_2d0,(uint)uStack_2d0);
      uStack_2d0._4_4_ = (uint)uStack_2d0;
      local_2e8 = CONCAT44(uVar114,uVar114);
      uStack_2e0._0_4_ = uVar114;
      uStack_2e0._4_4_ = uVar114;
      for (lVar111 = 4; uVar100 = SUB84(pRVar108,0), lVar111 < iVar121; lVar111 = lVar111 + 4) {
        uVar117 = (uint)lVar111;
        pRVar108 = (RTCIntersectArguments *)(bezier_basis0 + lVar110);
        pfVar1 = (float *)((long)&pRVar108->flags + lVar111 * 4);
        fVar190 = *pfVar1;
        fVar224 = pfVar1[1];
        fVar240 = pfVar1[2];
        fVar241 = pfVar1[3];
        pfVar1 = (float *)(lVar110 + 0x21fb768 + lVar111 * 4);
        fVar242 = *pfVar1;
        fVar264 = pfVar1[1];
        fVar364 = pfVar1[2];
        fVar269 = pfVar1[3];
        pfVar1 = (float *)(lVar110 + 0x21fbbec + lVar111 * 4);
        fVar278 = *pfVar1;
        fVar292 = pfVar1[1];
        fVar293 = pfVar1[2];
        fVar335 = pfVar1[3];
        pfVar1 = (float *)(lVar110 + 0x21fc070 + lVar111 * 4);
        fVar336 = *pfVar1;
        fVar365 = pfVar1[1];
        fVar372 = pfVar1[2];
        fVar375 = pfVar1[3];
        fVar396 = fVar305 * fVar190 + fVar313 * fVar242 + fVar320 * fVar278 + fVar220 * fVar336;
        fVar404 = fVar305 * fVar224 + fVar313 * fVar264 + fVar320 * fVar292 + fVar220 * fVar365;
        fVar405 = fVar305 * fVar240 + fVar313 * fVar364 + fVar320 * fVar293 + fVar220 * fVar372;
        fVar409 = fVar305 * fVar241 + fVar313 * fVar269 + fVar320 * fVar335 + fVar220 * fVar375;
        fVar410 = fVar371 * fVar190 + fVar346 * fVar242 + fVar326 * fVar278 + fVar225 * fVar336;
        fVar413 = fVar371 * fVar224 + fVar346 * fVar264 + fVar326 * fVar292 + fVar225 * fVar365;
        fVar351 = fVar371 * fVar240 + fVar346 * fVar364 + fVar326 * fVar293 + fVar225 * fVar372;
        fVar361 = fVar371 * fVar241 + fVar346 * fVar269 + fVar326 * fVar335 + fVar225 * fVar375;
        auVar204._0_4_ =
             fVar302 * fVar190 + fVar327 * fVar242 + fVar328 * fVar278 + fVar334 * fVar336;
        auVar204._4_4_ =
             fVar302 * fVar224 + fVar327 * fVar264 + fVar328 * fVar292 + fVar334 * fVar365;
        auVar204._8_4_ =
             fVar302 * fVar240 + fVar327 * fVar364 + fVar328 * fVar293 + fVar334 * fVar372;
        auVar204._12_4_ =
             fVar302 * fVar241 + fVar327 * fVar269 + fVar328 * fVar335 + fVar334 * fVar375;
        pfVar1 = (float *)(bezier_basis1 + lVar110 + lVar111 * 4);
        fVar377 = *pfVar1;
        fVar379 = pfVar1[1];
        fVar389 = pfVar1[2];
        fVar390 = pfVar1[3];
        pfVar1 = (float *)(lVar110 + 0x21fdb88 + lVar111 * 4);
        fVar391 = *pfVar1;
        fVar395 = pfVar1[1];
        fVar403 = pfVar1[2];
        fVar408 = pfVar1[3];
        pfVar1 = (float *)(lVar110 + 0x21fe00c + lVar111 * 4);
        fVar398 = *pfVar1;
        fVar407 = pfVar1[1];
        fVar366 = pfVar1[2];
        fVar373 = pfVar1[3];
        pauVar8 = (undefined1 (*) [12])(lVar110 + 0x21fe490 + lVar111 * 4);
        fVar376 = *(float *)*pauVar8;
        fVar378 = *(float *)(*pauVar8 + 4);
        fVar243 = *(float *)(*pauVar8 + 8);
        auVar64 = *pauVar8;
        fVar262 = *(float *)pauVar8[1];
        fVar267 = fVar305 * fVar377 + fVar313 * fVar391 + fVar320 * fVar398 + fVar220 * fVar376;
        fVar303 = fVar305 * fVar379 + fVar313 * fVar395 + fVar320 * fVar407 + fVar220 * fVar378;
        fVar306 = fVar305 * fVar389 + fVar313 * fVar403 + fVar320 * fVar366 + fVar220 * fVar243;
        fVar308 = fVar305 * fVar390 + fVar313 * fVar408 + fVar320 * fVar373 + fVar220 * fVar262;
        fVar310 = fVar371 * fVar377 + fVar346 * fVar391 + fVar326 * fVar398 + fVar225 * fVar376;
        fVar314 = fVar371 * fVar379 + fVar346 * fVar395 + fVar326 * fVar407 + fVar225 * fVar378;
        fVar316 = fVar371 * fVar389 + fVar346 * fVar403 + fVar326 * fVar366 + fVar225 * fVar243;
        fVar318 = fVar371 * fVar390 + fVar346 * fVar408 + fVar326 * fVar373 + fVar225 * fVar262;
        auVar393._0_4_ =
             fVar302 * fVar377 + fVar327 * fVar391 + fVar328 * fVar398 + fVar334 * fVar376;
        auVar393._4_4_ =
             fVar302 * fVar379 + fVar327 * fVar395 + fVar328 * fVar407 + fVar334 * fVar378;
        auVar393._8_4_ =
             fVar302 * fVar389 + fVar327 * fVar403 + fVar328 * fVar366 + fVar334 * fVar243;
        auVar393._12_4_ =
             fVar302 * fVar390 + fVar327 * fVar408 + fVar328 * fVar373 + fVar334 * fVar262;
        fVar294 = fVar267 - fVar396;
        fVar304 = fVar303 - fVar404;
        fVar307 = fVar306 - fVar405;
        fVar309 = fVar308 - fVar409;
        fVar376 = fVar310 - fVar410;
        fVar378 = fVar314 - fVar413;
        fVar243 = fVar316 - fVar351;
        fVar265 = fVar318 - fVar361;
        fVar412 = fVar410 * fVar294 - fVar396 * fVar376;
        fVar349 = fVar413 * fVar304 - fVar404 * fVar378;
        fVar352 = fVar351 * fVar307 - fVar405 * fVar243;
        fVar362 = fVar361 * fVar309 - fVar409 * fVar265;
        auVar144 = maxps(auVar204,auVar393);
        bVar87 = fVar412 * fVar412 <=
                 auVar144._0_4_ * auVar144._0_4_ * (fVar294 * fVar294 + fVar376 * fVar376) &&
                 (int)uVar117 < local_58;
        auVar312._0_4_ = -(uint)bVar87;
        bVar88 = fVar349 * fVar349 <=
                 auVar144._4_4_ * auVar144._4_4_ * (fVar304 * fVar304 + fVar378 * fVar378) &&
                 (int)(uVar117 | 1) < iStack_54;
        auVar312._4_4_ = -(uint)bVar88;
        bVar89 = fVar352 * fVar352 <=
                 auVar144._8_4_ * auVar144._8_4_ * (fVar307 * fVar307 + fVar243 * fVar243) &&
                 (int)(uVar117 | 2) < iStack_50;
        auVar312._8_4_ = -(uint)bVar89;
        bVar90 = fVar362 * fVar362 <=
                 auVar144._12_4_ * auVar144._12_4_ * (fVar309 * fVar309 + fVar265 * fVar265) &&
                 (int)(uVar117 | 3) < iStack_4c;
        auVar312._12_4_ = -(uint)bVar90;
        uVar115 = movmskps((int)pGVar109,auVar312);
        pGVar109 = (Geometry *)(ulong)uVar115;
        if (uVar115 != 0) {
          local_518._0_4_ = auVar64._0_4_;
          stack0xfffffffffffffaec = auVar64._4_4_;
          fStack_510 = auVar64._8_4_;
          fVar362 = (float)local_518._0_4_ * fVar218 + fVar398 * fVar280 + fVar391 * fVar374 +
                    fVar377 * fVar360;
          fVar363 = stack0xfffffffffffffaec * fVar218 + fVar407 * fVar280 + fVar395 * fVar374 +
                    fVar379 * fVar360;
          fVar122 = fStack_510 * fVar218 + fVar366 * fVar280 + fVar403 * fVar374 + fVar389 * fVar360
          ;
          fVar184 = fVar262 * fVar218 + fVar373 * fVar280 + fVar408 * fVar374 + fVar390 * fVar360;
          fVar221 = fVar336 * fVar218 + fVar278 * fVar280 + fVar242 * fVar374 + fVar190 * fVar360;
          fVar222 = fVar365 * fVar218 + fVar292 * fVar280 + fVar264 * fVar374 + fVar224 * fVar360;
          fVar244 = fVar372 * fVar218 + fVar293 * fVar280 + fVar364 * fVar374 + fVar240 * fVar360;
          fVar263 = fVar375 * fVar218 + fVar335 * fVar280 + fVar269 * fVar374 + fVar241 * fVar360;
          pfVar1 = (float *)(lVar110 + 0x21fc4f4 + lVar111 * 4);
          fVar190 = *pfVar1;
          fVar224 = pfVar1[1];
          fVar240 = pfVar1[2];
          fVar241 = pfVar1[3];
          pfVar1 = (float *)(lVar110 + 0x21fc978 + lVar111 * 4);
          fVar242 = *pfVar1;
          fVar264 = pfVar1[1];
          fVar364 = pfVar1[2];
          fVar269 = pfVar1[3];
          pfVar1 = (float *)(lVar110 + 0x21fcdfc + lVar111 * 4);
          fVar278 = *pfVar1;
          fVar292 = pfVar1[1];
          fVar293 = pfVar1[2];
          fVar335 = pfVar1[3];
          pfVar1 = (float *)(lVar110 + 0x21fd280 + lVar111 * 4);
          fVar336 = *pfVar1;
          fVar365 = pfVar1[1];
          fVar372 = pfVar1[2];
          fVar375 = pfVar1[3];
          fVar317 = fVar305 * fVar190 + fVar313 * fVar242 + fVar320 * fVar278 + fVar220 * fVar336;
          fVar319 = fVar305 * fVar224 + fVar313 * fVar264 + fVar320 * fVar292 + fVar220 * fVar365;
          fVar337 = fVar305 * fVar240 + fVar313 * fVar364 + fVar320 * fVar293 + fVar220 * fVar372;
          fVar347 = fVar305 * fVar241 + fVar313 * fVar269 + fVar320 * fVar335 + fVar220 * fVar375;
          fVar186 = fVar371 * fVar190 + fVar346 * fVar242 + fVar326 * fVar278 + fVar225 * fVar336;
          fVar188 = fVar371 * fVar224 + fVar346 * fVar264 + fVar326 * fVar292 + fVar225 * fVar365;
          fVar191 = fVar371 * fVar240 + fVar346 * fVar364 + fVar326 * fVar293 + fVar225 * fVar372;
          fVar219 = fVar371 * fVar241 + fVar346 * fVar269 + fVar326 * fVar335 + fVar225 * fVar375;
          pfVar1 = (float *)(lVar110 + 0x21fe914 + lVar111 * 4);
          fVar377 = *pfVar1;
          fVar379 = pfVar1[1];
          fVar389 = pfVar1[2];
          fVar390 = pfVar1[3];
          pfVar1 = (float *)(lVar110 + 0x21ff21c + lVar111 * 4);
          fVar391 = *pfVar1;
          fVar395 = pfVar1[1];
          fVar403 = pfVar1[2];
          fVar408 = pfVar1[3];
          pfVar1 = (float *)(lVar110 + 0x21ff6a0 + lVar111 * 4);
          fVar398 = *pfVar1;
          fVar407 = pfVar1[1];
          fVar366 = pfVar1[2];
          fVar373 = pfVar1[3];
          pfVar1 = (float *)(lVar110 + 0x21fed98 + lVar111 * 4);
          fVar262 = *pfVar1;
          fVar412 = pfVar1[1];
          fVar349 = pfVar1[2];
          fVar352 = pfVar1[3];
          fVar348 = fVar305 * fVar377 + fVar313 * fVar262 + fVar320 * fVar391 + fVar220 * fVar398;
          fVar350 = fVar305 * fVar379 + fVar313 * fVar412 + fVar320 * fVar395 + fVar220 * fVar407;
          fVar397 = fVar305 * fVar389 + fVar313 * fVar349 + fVar320 * fVar403 + fVar220 * fVar366;
          fVar406 = fVar305 * fVar390 + fVar313 * fVar352 + fVar320 * fVar408 + fVar220 * fVar373;
          fVar266 = fVar371 * fVar377 + fVar346 * fVar262 + fVar326 * fVar391 + fVar225 * fVar398;
          fVar268 = fVar371 * fVar379 + fVar346 * fVar412 + fVar326 * fVar395 + fVar225 * fVar407;
          fVar311 = fVar371 * fVar389 + fVar346 * fVar349 + fVar326 * fVar403 + fVar225 * fVar366;
          fVar315 = fVar371 * fVar390 + fVar346 * fVar352 + fVar326 * fVar408 + fVar225 * fVar373;
          auVar370._0_8_ = CONCAT44(fVar319,fVar317) & 0x7fffffff7fffffff;
          auVar370._8_4_ = ABS(fVar337);
          auVar370._12_4_ = ABS(fVar347);
          auVar288._0_8_ = CONCAT44(fVar188,fVar186) & 0x7fffffff7fffffff;
          auVar288._8_4_ = ABS(fVar191);
          auVar288._12_4_ = ABS(fVar219);
          auVar144 = maxps(auVar370,auVar288);
          auVar387._0_8_ =
               CONCAT44(fVar224 * fVar360 +
                        fVar264 * fVar374 + fVar292 * fVar280 + fVar365 * fVar218,
                        fVar190 * fVar360 +
                        fVar242 * fVar374 + fVar278 * fVar280 + fVar336 * fVar218) &
               0x7fffffff7fffffff;
          auVar387._8_4_ =
               ABS(fVar240 * fVar360 + fVar364 * fVar374 + fVar293 * fVar280 + fVar372 * fVar218);
          auVar387._12_4_ =
               ABS(fVar241 * fVar360 + fVar269 * fVar374 + fVar335 * fVar280 + fVar375 * fVar218);
          auVar144 = maxps(auVar144,auVar387);
          uVar115 = -(uint)(local_478 <= auVar144._0_4_);
          uVar116 = -(uint)(local_478 <= auVar144._4_4_);
          uVar118 = -(uint)(local_478 <= auVar144._8_4_);
          uVar119 = -(uint)(local_478 <= auVar144._12_4_);
          auVar289._0_4_ = ~uVar115 & (uint)fVar294;
          auVar289._4_4_ = ~uVar116 & (uint)fVar304;
          auVar289._8_4_ = ~uVar118 & (uint)fVar307;
          auVar289._12_4_ = ~uVar119 & (uint)fVar309;
          auVar359._0_4_ = (uint)fVar317 & uVar115;
          auVar359._4_4_ = (uint)fVar319 & uVar116;
          auVar359._8_4_ = (uint)fVar337 & uVar118;
          auVar359._12_4_ = (uint)fVar347 & uVar119;
          auVar359 = auVar359 | auVar289;
          fVar186 = (float)(~uVar115 & (uint)fVar376 | (uint)fVar186 & uVar115);
          fVar188 = (float)(~uVar116 & (uint)fVar378 | (uint)fVar188 & uVar116);
          fVar191 = (float)(~uVar118 & (uint)fVar243 | (uint)fVar191 & uVar118);
          fVar219 = (float)(~uVar119 & (uint)fVar265 | (uint)fVar219 & uVar119);
          auVar388._0_8_ = CONCAT44(fVar350,fVar348) & 0x7fffffff7fffffff;
          auVar388._8_4_ = ABS(fVar397);
          auVar388._12_4_ = ABS(fVar406);
          auVar233._0_8_ = CONCAT44(fVar268,fVar266) & 0x7fffffff7fffffff;
          auVar233._8_4_ = ABS(fVar311);
          auVar233._12_4_ = ABS(fVar315);
          auVar144 = maxps(auVar388,auVar233);
          auVar173._0_8_ =
               CONCAT44(fVar379 * fVar360 +
                        fVar412 * fVar374 + fVar395 * fVar280 + fVar407 * fVar218,
                        fVar377 * fVar360 +
                        fVar262 * fVar374 + fVar391 * fVar280 + fVar398 * fVar218) &
               0x7fffffff7fffffff;
          auVar173._8_4_ =
               ABS(fVar389 * fVar360 + fVar349 * fVar374 + fVar403 * fVar280 + fVar366 * fVar218);
          auVar173._12_4_ =
               ABS(fVar390 * fVar360 + fVar352 * fVar374 + fVar408 * fVar280 + fVar373 * fVar218);
          auVar144 = maxps(auVar144,auVar173);
          uVar115 = -(uint)(local_478 <= auVar144._0_4_);
          uVar116 = -(uint)(local_478 <= auVar144._4_4_);
          uVar118 = -(uint)(local_478 <= auVar144._8_4_);
          uVar119 = -(uint)(local_478 <= auVar144._12_4_);
          fVar398 = (float)((uint)fVar348 & uVar115 | ~uVar115 & (uint)fVar294);
          fVar366 = (float)((uint)fVar350 & uVar116 | ~uVar116 & (uint)fVar304);
          fVar349 = (float)((uint)fVar397 & uVar118 | ~uVar118 & (uint)fVar307);
          fVar352 = (float)((uint)fVar406 & uVar119 | ~uVar119 & (uint)fVar309);
          fVar377 = (float)(~uVar115 & (uint)fVar376 | (uint)fVar266 & uVar115);
          fVar389 = (float)(~uVar116 & (uint)fVar378 | (uint)fVar268 & uVar116);
          fVar391 = (float)(~uVar118 & (uint)fVar243 | (uint)fVar311 & uVar118);
          fVar403 = (float)(~uVar119 & (uint)fVar265 | (uint)fVar315 & uVar119);
          fVar269 = auVar359._0_4_;
          fVar190 = auVar359._4_4_;
          fVar224 = auVar359._8_4_;
          fVar240 = auVar359._12_4_;
          auVar274._0_4_ = fVar186 * fVar186 + fVar269 * fVar269;
          auVar274._4_4_ = fVar188 * fVar188 + fVar190 * fVar190;
          auVar274._8_4_ = fVar191 * fVar191 + fVar224 * fVar224;
          auVar274._12_4_ = fVar219 * fVar219 + fVar240 * fVar240;
          auVar144 = rsqrtps(auVar289,auVar274);
          fVar241 = auVar144._0_4_;
          fVar242 = auVar144._4_4_;
          fVar264 = auVar144._8_4_;
          fVar364 = auVar144._12_4_;
          auVar290._0_4_ = fVar241 * fVar241 * auVar274._0_4_ * 0.5 * fVar241;
          auVar290._4_4_ = fVar242 * fVar242 * auVar274._4_4_ * 0.5 * fVar242;
          auVar290._8_4_ = fVar264 * fVar264 * auVar274._8_4_ * 0.5 * fVar264;
          auVar290._12_4_ = fVar364 * fVar364 * auVar274._12_4_ * 0.5 * fVar364;
          fVar336 = fVar241 * 1.5 - auVar290._0_4_;
          fVar365 = fVar242 * 1.5 - auVar290._4_4_;
          fVar372 = fVar264 * 1.5 - auVar290._8_4_;
          fVar375 = fVar364 * 1.5 - auVar290._12_4_;
          auVar275._0_4_ = fVar377 * fVar377 + fVar398 * fVar398;
          auVar275._4_4_ = fVar389 * fVar389 + fVar366 * fVar366;
          auVar275._8_4_ = fVar391 * fVar391 + fVar349 * fVar349;
          auVar275._12_4_ = fVar403 * fVar403 + fVar352 * fVar352;
          auVar144 = rsqrtps(auVar290,auVar275);
          fVar241 = auVar144._0_4_;
          fVar242 = auVar144._4_4_;
          fVar264 = auVar144._8_4_;
          fVar364 = auVar144._12_4_;
          fVar278 = fVar241 * 1.5 - fVar241 * fVar241 * auVar275._0_4_ * 0.5 * fVar241;
          fVar292 = fVar242 * 1.5 - fVar242 * fVar242 * auVar275._4_4_ * 0.5 * fVar242;
          fVar293 = fVar264 * 1.5 - fVar264 * fVar264 * auVar275._8_4_ * 0.5 * fVar264;
          fVar335 = fVar364 * 1.5 - fVar364 * fVar364 * auVar275._12_4_ * 0.5 * fVar364;
          fVar407 = fVar186 * fVar336 * auVar204._0_4_;
          fVar373 = fVar188 * fVar365 * auVar204._4_4_;
          fVar378 = fVar191 * fVar372 * auVar204._8_4_;
          fVar262 = fVar219 * fVar375 * auVar204._12_4_;
          fVar242 = -fVar269 * fVar336 * auVar204._0_4_;
          fVar264 = -fVar190 * fVar365 * auVar204._4_4_;
          fVar364 = -fVar224 * fVar372 * auVar204._8_4_;
          fVar269 = -fVar240 * fVar375 * auVar204._12_4_;
          fVar379 = fVar336 * 0.0 * auVar204._0_4_;
          fVar390 = fVar365 * 0.0 * auVar204._4_4_;
          fVar395 = fVar372 * 0.0 * auVar204._8_4_;
          fVar408 = fVar375 * 0.0 * auVar204._12_4_;
          fVar265 = fVar377 * fVar278 * auVar393._0_4_;
          fVar294 = fVar389 * fVar292 * auVar393._4_4_;
          fVar311 = fVar391 * fVar293 * auVar393._8_4_;
          fVar315 = fVar403 * fVar335 * auVar393._12_4_;
          fVar304 = fVar267 + fVar265;
          fVar307 = fVar303 + fVar294;
          fVar309 = fVar306 + fVar311;
          fVar412 = fVar308 + fVar315;
          fVar190 = -fVar398 * fVar278 * auVar393._0_4_;
          fVar224 = -fVar366 * fVar292 * auVar393._4_4_;
          fVar240 = -fVar349 * fVar293 * auVar393._8_4_;
          fVar241 = -fVar352 * fVar335 * auVar393._12_4_;
          fVar349 = fVar310 + fVar190;
          fVar352 = fVar314 + fVar224;
          fVar186 = fVar316 + fVar240;
          fVar188 = fVar318 + fVar241;
          fVar336 = fVar278 * 0.0 * auVar393._0_4_;
          fVar365 = fVar292 * 0.0 * auVar393._4_4_;
          fVar372 = fVar293 * 0.0 * auVar393._8_4_;
          fVar375 = fVar335 * 0.0 * auVar393._12_4_;
          fVar377 = fVar396 - fVar407;
          fVar389 = fVar404 - fVar373;
          fVar391 = fVar405 - fVar378;
          fVar403 = fVar409 - fVar262;
          fVar191 = fVar362 + fVar336;
          fVar219 = fVar363 + fVar365;
          fVar266 = fVar122 + fVar372;
          fVar268 = fVar184 + fVar375;
          fVar398 = fVar410 - fVar242;
          fVar366 = fVar413 - fVar264;
          fVar376 = fVar351 - fVar364;
          fVar243 = fVar361 - fVar269;
          fVar278 = fVar221 - fVar379;
          fVar292 = fVar222 - fVar390;
          fVar293 = fVar244 - fVar395;
          fVar335 = fVar263 - fVar408;
          uVar115 = -(uint)(0.0 < (fVar398 * (fVar191 - fVar278) - fVar278 * (fVar349 - fVar398)) *
                                  0.0 + (fVar278 * (fVar304 - fVar377) -
                                        (fVar191 - fVar278) * fVar377) * 0.0 +
                                        ((fVar349 - fVar398) * fVar377 -
                                        (fVar304 - fVar377) * fVar398));
          uVar116 = -(uint)(0.0 < (fVar366 * (fVar219 - fVar292) - fVar292 * (fVar352 - fVar366)) *
                                  0.0 + (fVar292 * (fVar307 - fVar389) -
                                        (fVar219 - fVar292) * fVar389) * 0.0 +
                                        ((fVar352 - fVar366) * fVar389 -
                                        (fVar307 - fVar389) * fVar366));
          uVar118 = -(uint)(0.0 < (fVar376 * (fVar266 - fVar293) - fVar293 * (fVar186 - fVar376)) *
                                  0.0 + (fVar293 * (fVar309 - fVar391) -
                                        (fVar266 - fVar293) * fVar391) * 0.0 +
                                        ((fVar186 - fVar376) * fVar391 -
                                        (fVar309 - fVar391) * fVar376));
          uVar119 = -(uint)(0.0 < (fVar243 * (fVar268 - fVar335) - fVar335 * (fVar188 - fVar243)) *
                                  0.0 + (fVar335 * (fVar412 - fVar403) -
                                        (fVar268 - fVar335) * fVar403) * 0.0 +
                                        ((fVar188 - fVar243) * fVar403 -
                                        (fVar412 - fVar403) * fVar243));
          fVar265 = (float)((uint)(fVar267 - fVar265) & uVar115 |
                           ~uVar115 & (uint)(fVar396 + fVar407));
          fVar267 = (float)((uint)(fVar303 - fVar294) & uVar116 |
                           ~uVar116 & (uint)(fVar404 + fVar373));
          fVar294 = (float)((uint)(fVar306 - fVar311) & uVar118 |
                           ~uVar118 & (uint)(fVar405 + fVar378));
          fVar303 = (float)((uint)(fVar308 - fVar315) & uVar119 |
                           ~uVar119 & (uint)(fVar409 + fVar262));
          fVar396 = (float)((uint)(fVar310 - fVar190) & uVar115 |
                           ~uVar115 & (uint)(fVar410 + fVar242));
          fVar404 = (float)((uint)(fVar314 - fVar224) & uVar116 |
                           ~uVar116 & (uint)(fVar413 + fVar264));
          fVar405 = (float)((uint)(fVar316 - fVar240) & uVar118 |
                           ~uVar118 & (uint)(fVar351 + fVar364));
          fVar318 = (float)((uint)(fVar318 - fVar241) & uVar119 |
                           ~uVar119 & (uint)(fVar361 + fVar269));
          fVar242 = (float)((uint)(fVar362 - fVar336) & uVar115 |
                           ~uVar115 & (uint)(fVar221 + fVar379));
          fVar264 = (float)((uint)(fVar363 - fVar365) & uVar116 |
                           ~uVar116 & (uint)(fVar222 + fVar390));
          fVar364 = (float)((uint)(fVar122 - fVar372) & uVar118 |
                           ~uVar118 & (uint)(fVar244 + fVar395));
          fVar269 = (float)((uint)(fVar184 - fVar375) & uVar119 |
                           ~uVar119 & (uint)(fVar263 + fVar408));
          fVar379 = (float)((uint)fVar377 & uVar115 | ~uVar115 & (uint)fVar304);
          fVar390 = (float)((uint)fVar389 & uVar116 | ~uVar116 & (uint)fVar307);
          fVar395 = (float)((uint)fVar391 & uVar118 | ~uVar118 & (uint)fVar309);
          fVar408 = (float)((uint)fVar403 & uVar119 | ~uVar119 & (uint)fVar412);
          fVar407 = (float)((uint)fVar398 & uVar115 | ~uVar115 & (uint)fVar349);
          fVar373 = (float)((uint)fVar366 & uVar116 | ~uVar116 & (uint)fVar352);
          fVar378 = (float)((uint)fVar376 & uVar118 | ~uVar118 & (uint)fVar186);
          fVar262 = (float)((uint)fVar243 & uVar119 | ~uVar119 & (uint)fVar188);
          fVar336 = (float)((uint)fVar278 & uVar115 | ~uVar115 & (uint)fVar191);
          fVar365 = (float)((uint)fVar292 & uVar116 | ~uVar116 & (uint)fVar219);
          fVar372 = (float)((uint)fVar293 & uVar118 | ~uVar118 & (uint)fVar266);
          fVar375 = (float)((uint)fVar335 & uVar119 | ~uVar119 & (uint)fVar268);
          fVar377 = (float)((uint)fVar304 & uVar115 | ~uVar115 & (uint)fVar377) - fVar265;
          fVar389 = (float)((uint)fVar307 & uVar116 | ~uVar116 & (uint)fVar389) - fVar267;
          fVar391 = (float)((uint)fVar309 & uVar118 | ~uVar118 & (uint)fVar391) - fVar294;
          fVar403 = (float)((uint)fVar412 & uVar119 | ~uVar119 & (uint)fVar403) - fVar303;
          fVar398 = (float)((uint)fVar349 & uVar115 | ~uVar115 & (uint)fVar398) - fVar396;
          fVar366 = (float)((uint)fVar352 & uVar116 | ~uVar116 & (uint)fVar366) - fVar404;
          fVar376 = (float)((uint)fVar186 & uVar118 | ~uVar118 & (uint)fVar376) - fVar405;
          fVar243 = (float)((uint)fVar188 & uVar119 | ~uVar119 & (uint)fVar243) - fVar318;
          fVar304 = (float)((uint)fVar191 & uVar115 | ~uVar115 & (uint)fVar278) - fVar242;
          fVar306 = (float)((uint)fVar219 & uVar116 | ~uVar116 & (uint)fVar292) - fVar264;
          fVar307 = (float)((uint)fVar266 & uVar118 | ~uVar118 & (uint)fVar293) - fVar364;
          fVar308 = (float)((uint)fVar268 & uVar119 | ~uVar119 & (uint)fVar335) - fVar269;
          fVar409 = fVar265 - fVar379;
          fVar410 = fVar267 - fVar390;
          fVar412 = fVar294 - fVar395;
          fVar413 = fVar303 - fVar408;
          fVar190 = fVar396 - fVar407;
          fVar224 = fVar404 - fVar373;
          fVar240 = fVar405 - fVar378;
          fVar241 = fVar318 - fVar262;
          fVar278 = fVar242 - fVar336;
          fVar292 = fVar264 - fVar365;
          fVar293 = fVar364 - fVar372;
          fVar335 = fVar269 - fVar375;
          fVar309 = (fVar396 * fVar304 - fVar242 * fVar398) * 0.0 +
                    (fVar242 * fVar377 - fVar265 * fVar304) * 0.0 +
                    (fVar265 * fVar398 - fVar396 * fVar377);
          fVar310 = (fVar404 * fVar306 - fVar264 * fVar366) * 0.0 +
                    (fVar264 * fVar389 - fVar267 * fVar306) * 0.0 +
                    (fVar267 * fVar366 - fVar404 * fVar389);
          auVar256._4_4_ = fVar310;
          auVar256._0_4_ = fVar309;
          fVar314 = (fVar405 * fVar307 - fVar364 * fVar376) * 0.0 +
                    (fVar364 * fVar391 - fVar294 * fVar307) * 0.0 +
                    (fVar294 * fVar376 - fVar405 * fVar391);
          fVar316 = (fVar318 * fVar308 - fVar269 * fVar243) * 0.0 +
                    (fVar269 * fVar403 - fVar303 * fVar308) * 0.0 +
                    (fVar303 * fVar243 - fVar318 * fVar403);
          auVar394._0_4_ =
               (fVar407 * fVar278 - fVar336 * fVar190) * 0.0 +
               (fVar336 * fVar409 - fVar379 * fVar278) * 0.0 +
               (fVar379 * fVar190 - fVar407 * fVar409);
          auVar394._4_4_ =
               (fVar373 * fVar292 - fVar365 * fVar224) * 0.0 +
               (fVar365 * fVar410 - fVar390 * fVar292) * 0.0 +
               (fVar390 * fVar224 - fVar373 * fVar410);
          auVar394._8_4_ =
               (fVar378 * fVar293 - fVar372 * fVar240) * 0.0 +
               (fVar372 * fVar412 - fVar395 * fVar293) * 0.0 +
               (fVar395 * fVar240 - fVar378 * fVar412);
          auVar394._12_4_ =
               (fVar262 * fVar335 - fVar375 * fVar241) * 0.0 +
               (fVar375 * fVar413 - fVar408 * fVar335) * 0.0 +
               (fVar408 * fVar241 - fVar262 * fVar413);
          auVar256._8_4_ = fVar314;
          auVar256._12_4_ = fVar316;
          auVar144 = maxps(auVar256,auVar394);
          bVar87 = auVar144._0_4_ <= 0.0 && bVar87;
          auVar257._0_4_ = -(uint)bVar87;
          bVar88 = auVar144._4_4_ <= 0.0 && bVar88;
          auVar257._4_4_ = -(uint)bVar88;
          bVar89 = auVar144._8_4_ <= 0.0 && bVar89;
          auVar257._8_4_ = -(uint)bVar89;
          bVar90 = auVar144._12_4_ <= 0.0 && bVar90;
          auVar257._12_4_ = -(uint)bVar90;
          iVar181 = movmskps((int)(bezier_basis1 + lVar110),auVar257);
          if (iVar181 == 0) {
            auVar235._8_8_ = uStack_400;
            auVar235._0_8_ = local_408;
            iVar181 = 0;
          }
          else {
            fVar365 = fVar190 * fVar304 - fVar278 * fVar398;
            fVar372 = fVar224 * fVar306 - fVar292 * fVar366;
            fVar375 = fVar240 * fVar307 - fVar293 * fVar376;
            fVar379 = fVar241 * fVar308 - fVar335 * fVar243;
            fVar336 = fVar278 * fVar377 - fVar304 * fVar409;
            fVar292 = fVar292 * fVar389 - fVar306 * fVar410;
            fVar293 = fVar293 * fVar391 - fVar307 * fVar412;
            fVar335 = fVar335 * fVar403 - fVar308 * fVar413;
            fVar190 = fVar409 * fVar398 - fVar190 * fVar377;
            fVar377 = fVar410 * fVar366 - fVar224 * fVar389;
            fVar389 = fVar412 * fVar376 - fVar240 * fVar391;
            fVar390 = fVar413 * fVar243 - fVar241 * fVar403;
            auVar234._0_4_ = fVar336 * 0.0 + fVar190;
            auVar234._4_4_ = fVar292 * 0.0 + fVar377;
            auVar234._8_4_ = fVar293 * 0.0 + fVar389;
            auVar234._12_4_ = fVar335 * 0.0 + fVar390;
            auVar301._0_4_ = fVar365 * 0.0 + auVar234._0_4_;
            auVar301._4_4_ = fVar372 * 0.0 + auVar234._4_4_;
            auVar301._8_4_ = fVar375 * 0.0 + auVar234._8_4_;
            auVar301._12_4_ = fVar379 * 0.0 + auVar234._12_4_;
            auVar144 = rcpps(auVar234,auVar301);
            fVar224 = auVar144._0_4_;
            fVar240 = auVar144._4_4_;
            fVar241 = auVar144._8_4_;
            fVar278 = auVar144._12_4_;
            fVar224 = (1.0 - auVar301._0_4_ * fVar224) * fVar224 + fVar224;
            fVar240 = (1.0 - auVar301._4_4_ * fVar240) * fVar240 + fVar240;
            fVar241 = (1.0 - auVar301._8_4_ * fVar241) * fVar241 + fVar241;
            fVar278 = (1.0 - auVar301._12_4_ * fVar278) * fVar278 + fVar278;
            fVar242 = (fVar242 * fVar190 + fVar396 * fVar336 + fVar265 * fVar365) * fVar224;
            fVar264 = (fVar264 * fVar377 + fVar404 * fVar292 + fVar267 * fVar372) * fVar240;
            fVar364 = (fVar364 * fVar389 + fVar405 * fVar293 + fVar294 * fVar375) * fVar241;
            fVar269 = (fVar269 * fVar390 + fVar318 * fVar335 + fVar303 * fVar379) * fVar278;
            fVar190 = *(float *)(ray + k * 4 + 0x80);
            bVar87 = (fVar242 <= fVar190 && (float)local_3c8._0_4_ <= fVar242) && bVar87;
            auVar276._0_4_ = -(uint)bVar87;
            bVar88 = (fVar264 <= fVar190 && (float)local_3c8._4_4_ <= fVar264) && bVar88;
            auVar276._4_4_ = -(uint)bVar88;
            bVar89 = (fVar364 <= fVar190 && fStack_3c0 <= fVar364) && bVar89;
            auVar276._8_4_ = -(uint)bVar89;
            bVar90 = (fVar269 <= fVar190 && fStack_3bc <= fVar269) && bVar90;
            auVar276._12_4_ = -(uint)bVar90;
            iVar181 = movmskps(iVar181,auVar276);
            if (iVar181 == 0) {
              auVar235._8_8_ = uStack_400;
              auVar235._0_8_ = local_408;
              iVar181 = 0;
            }
            else {
              auVar277._0_8_ =
                   CONCAT44(-(uint)(auVar301._4_4_ != 0.0 && bVar88),
                            -(uint)(auVar301._0_4_ != 0.0 && bVar87));
              auVar277._8_4_ = -(uint)(auVar301._8_4_ != 0.0 && bVar89);
              auVar277._12_4_ = -(uint)(auVar301._12_4_ != 0.0 && bVar90);
              iVar181 = movmskps(iVar181,auVar277);
              auVar235._8_8_ = uStack_400;
              auVar235._0_8_ = local_408;
              if (iVar181 != 0) {
                fVar309 = fVar309 * fVar224;
                fVar310 = fVar310 * fVar240;
                fVar314 = fVar314 * fVar241;
                fVar316 = fVar316 * fVar278;
                local_488 = (float)((uint)(1.0 - fVar309) & uVar115 | ~uVar115 & (uint)fVar309);
                fStack_484 = (float)((uint)(1.0 - fVar310) & uVar116 | ~uVar116 & (uint)fVar310);
                fStack_480 = (float)((uint)(1.0 - fVar314) & uVar118 | ~uVar118 & (uint)fVar314);
                fStack_47c = (float)((uint)(1.0 - fVar316) & uVar119 | ~uVar119 & (uint)fVar316);
                local_298 = (float)(~uVar115 & (uint)(auVar394._0_4_ * fVar224) |
                                   (uint)(1.0 - auVar394._0_4_ * fVar224) & uVar115);
                fStack_294 = (float)(~uVar116 & (uint)(auVar394._4_4_ * fVar240) |
                                    (uint)(1.0 - auVar394._4_4_ * fVar240) & uVar116);
                fStack_290 = (float)(~uVar118 & (uint)(auVar394._8_4_ * fVar241) |
                                    (uint)(1.0 - auVar394._8_4_ * fVar241) & uVar118);
                fStack_28c = (float)(~uVar119 & (uint)(auVar394._12_4_ * fVar278) |
                                    (uint)(1.0 - auVar394._12_4_ * fVar278) & uVar119);
                auVar235._8_4_ = auVar277._8_4_;
                auVar235._0_8_ = auVar277._0_8_;
                auVar235._12_4_ = auVar277._12_4_;
                local_388 = fVar242;
                fStack_384 = fVar264;
                fStack_380 = fVar364;
                fStack_37c = fVar269;
              }
            }
          }
          iVar181 = movmskps(iVar181,auVar235);
          if (iVar181 != 0) {
            fVar224 = (auVar393._0_4_ - auVar204._0_4_) * local_488 + auVar204._0_4_;
            fVar240 = (auVar393._4_4_ - auVar204._4_4_) * fStack_484 + auVar204._4_4_;
            fVar241 = (auVar393._8_4_ - auVar204._8_4_) * fStack_480 + auVar204._8_4_;
            fVar242 = (auVar393._12_4_ - auVar204._12_4_) * fStack_47c + auVar204._12_4_;
            fVar190 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
            aVar174._0_4_ = -(uint)(fVar190 * (fVar224 + fVar224) < local_388) & auVar235._0_4_;
            aVar174._4_4_ = -(uint)(fVar190 * (fVar240 + fVar240) < fStack_384) & auVar235._4_4_;
            aVar174._8_4_ = -(uint)(fVar190 * (fVar241 + fVar241) < fStack_380) & auVar235._8_4_;
            aVar174._12_4_ = -(uint)(fVar190 * (fVar242 + fVar242) < fStack_37c) & auVar235._12_4_;
            iVar181 = movmskps((int)pre,(undefined1  [16])aVar174);
            if (iVar181 != 0) {
              local_298 = local_298 + local_298 + -1.0;
              fStack_294 = fStack_294 + fStack_294 + -1.0;
              fStack_290 = fStack_290 + fStack_290 + -1.0;
              fStack_28c = fStack_28c + fStack_28c + -1.0;
              bhit.U.field_0.v[1] = fStack_484;
              bhit.U.field_0.v[0] = local_488;
              bhit.U.field_0.v[2] = fStack_480;
              bhit.U.field_0.v[3] = fStack_47c;
              bhit.T.field_0.v[1] = fStack_384;
              bhit.T.field_0.v[0] = local_388;
              bhit.T.field_0.v[2] = fStack_380;
              bhit.T.field_0.v[3] = fStack_37c;
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v0.field_0._0_8_ =
                   CONCAT44(fVar291,fVar279);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v0.field_0._8_8_ =
                   CONCAT44(fVar302,fVar189);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v1.field_0._0_8_ =
                   CONCAT44(fStack_3e4,local_3e8);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v1.field_0._8_8_ =
                   CONCAT44(fStack_3dc,fStack_3e0);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v2.field_0._0_8_ =
                   CONCAT44(fStack_3f4,local_3f8);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v2.field_0._8_8_ =
                   CONCAT44(fStack_3ec,fStack_3f0);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v3.field_0._0_8_ =
                   CONCAT44(fStack_3d4,local_3d8);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v3.field_0._8_8_ =
                   CONCAT44(fStack_3cc,fStack_3d0);
              pGVar109 = (context->scene->geometries).items[(long)local_410].ptr;
              pRVar108 = local_410;
              bhit.V.field_0.v[0] = local_298;
              bhit.V.field_0.v[1] = fStack_294;
              bhit.V.field_0.v[2] = fStack_290;
              bhit.V.field_0.v[3] = fStack_28c;
              bhit.i = uVar117;
              bhit.N = iVar121;
              bhit.valid.field_0 = aVar174;
              if ((pGVar109->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar190 = (float)(int)uVar117;
                bhit.vu.field_0.v[0] = (fVar190 + local_488 + 0.0) * local_68;
                bhit.vu.field_0.v[1] = (fVar190 + fStack_484 + 1.0) * fStack_64;
                bhit.vu.field_0.v[2] = (fVar190 + fStack_480 + 2.0) * fStack_60;
                bhit.vu.field_0.v[3] = (fVar190 + fStack_47c + 3.0) * fStack_5c;
                bhit.vv.field_0._0_8_ = CONCAT44(fStack_294,local_298);
                bhit.vv.field_0._8_8_ = CONCAT44(fStack_28c,fStack_290);
                bhit.vt.field_0.v[1] = fStack_384;
                bhit.vt.field_0.v[0] = local_388;
                bhit.vt.field_0.v[2] = fStack_380;
                bhit.vt.field_0.v[3] = fStack_37c;
                auVar205._0_4_ = aVar174._0_4_ & (uint)local_388;
                auVar205._4_4_ = aVar174._4_4_ & (uint)fStack_384;
                auVar205._8_4_ = aVar174._8_4_ & (uint)fStack_380;
                auVar205._12_4_ = aVar174._12_4_ & (uint)fStack_37c;
                auVar236._0_8_ = CONCAT44(~aVar174._4_4_,~aVar174._0_4_) & 0x7f8000007f800000;
                auVar236._8_4_ = ~aVar174._8_4_ & 0x7f800000;
                auVar236._12_4_ = ~aVar174._12_4_ & 0x7f800000;
                auVar236 = auVar236 | auVar205;
                auVar258._4_4_ = auVar236._0_4_;
                auVar258._0_4_ = auVar236._4_4_;
                auVar258._8_4_ = auVar236._12_4_;
                auVar258._12_4_ = auVar236._8_4_;
                auVar144 = minps(auVar258,auVar236);
                auVar206._0_8_ = auVar144._8_8_;
                auVar206._8_4_ = auVar144._0_4_;
                auVar206._12_4_ = auVar144._4_4_;
                auVar144 = minps(auVar206,auVar144);
                auVar207._0_8_ =
                     CONCAT44(-(uint)(auVar144._4_4_ == auVar236._4_4_) & aVar174._4_4_,
                              -(uint)(auVar144._0_4_ == auVar236._0_4_) & aVar174._0_4_);
                auVar207._8_4_ = -(uint)(auVar144._8_4_ == auVar236._8_4_) & aVar174._8_4_;
                auVar207._12_4_ = -(uint)(auVar144._12_4_ == auVar236._12_4_) & aVar174._12_4_;
                iVar181 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar207);
                aVar175 = aVar174;
                if (iVar181 != 0) {
                  aVar175.i[2] = auVar207._8_4_;
                  aVar175._0_8_ = auVar207._0_8_;
                  aVar175.i[3] = auVar207._12_4_;
                }
                uVar115 = movmskps(iVar181,(undefined1  [16])aVar175);
                lVar112 = 0;
                if (uVar115 != 0) {
                  for (; (uVar115 >> lVar112 & 1) == 0; lVar112 = lVar112 + 1) {
                  }
                }
                valid.field_0 = aVar174;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar109->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar190 = bhit.vu.field_0.v[lVar112];
                  fVar224 = bhit.vv.field_0.v[lVar112];
                  fVar240 = 1.0 - fVar190;
                  fVar242 = fVar190 * fVar240 + fVar190 * fVar240;
                  fVar241 = fVar240 * fVar240 * -3.0;
                  fVar264 = (fVar240 * fVar240 - fVar242) * 3.0;
                  fVar240 = (fVar242 - fVar190 * fVar190) * 3.0;
                  fVar242 = fVar190 * fVar190 * 3.0;
                  *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[lVar112];
                  *(float *)(ray + k * 4 + 0xc0) =
                       fVar241 * fVar279 +
                       fVar264 * local_3e8 + fVar240 * local_3f8 + fVar242 * local_3d8;
                  *(float *)(ray + k * 4 + 0xd0) =
                       fVar241 * fVar291 +
                       fVar264 * fStack_3e4 + fVar240 * fStack_3f4 + fVar242 * fStack_3d4;
                  *(float *)(ray + k * 4 + 0xe0) =
                       fVar241 * fVar189 +
                       fVar264 * fStack_3e0 + fVar240 * fStack_3f0 + fVar242 * fStack_3d0;
                  *(float *)(ray + k * 4 + 0xf0) = fVar190;
                  *(float *)(ray + k * 4 + 0x100) = fVar224;
                  *(uint *)(ray + k * 4 + 0x110) = uVar114;
                  *(int *)(ray + k * 4 + 0x120) = (int)local_410;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  pRVar108 = (RTCIntersectArguments *)context;
                }
                else {
                  auVar64 = *(undefined1 (*) [12])*(undefined1 (*) [16])(mm_lookupmask_ps + lVar107)
                  ;
                  uStack_48c = (undefined4)
                               ((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar107 + 8) >> 0x20);
                  _local_518 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  while( true ) {
                    local_c8 = bhit.vu.field_0.v[lVar112];
                    local_b8 = bhit.vv.field_0.v[lVar112];
                    *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[lVar112];
                    fVar190 = 1.0 - local_c8;
                    fVar240 = local_c8 * fVar190 + local_c8 * fVar190;
                    fVar241 = (fVar240 - local_c8 * local_c8) * 3.0;
                    fVar224 = local_c8 * local_c8 * 3.0;
                    fVar240 = (fVar190 * fVar190 - fVar240) * 3.0;
                    args.context = context->user;
                    fVar190 = fVar190 * fVar190 * -3.0;
                    local_f8 = fVar190 * fVar279 +
                               fVar240 * local_3e8 + fVar241 * local_3f8 + fVar224 * local_3d8;
                    local_e8 = fVar190 * fVar291 +
                               fVar240 * fStack_3e4 + fVar241 * fStack_3f4 + fVar224 * fStack_3d4;
                    local_d8 = fVar190 * fVar189 +
                               fVar240 * fStack_3e0 + fVar241 * fStack_3f0 + fVar224 * fStack_3d0;
                    fStack_f4 = local_f8;
                    fStack_f0 = local_f8;
                    fStack_ec = local_f8;
                    fStack_e4 = local_e8;
                    fStack_e0 = local_e8;
                    fStack_dc = local_e8;
                    fStack_d4 = local_d8;
                    fStack_d0 = local_d8;
                    fStack_cc = local_d8;
                    fStack_c4 = local_c8;
                    fStack_c0 = local_c8;
                    fStack_bc = local_c8;
                    fStack_b4 = local_b8;
                    fStack_b0 = local_b8;
                    fStack_ac = local_b8;
                    local_a8 = local_2e8;
                    uStack_a0 = uStack_2e0;
                    local_98 = local_2d8;
                    uStack_90 = uStack_2d0;
                    local_88 = (args.context)->instID[0];
                    uStack_84 = local_88;
                    uStack_80 = local_88;
                    uStack_7c = local_88;
                    local_78 = (args.context)->instPrimID[0];
                    uStack_74 = local_78;
                    uStack_70 = local_78;
                    uStack_6c = local_78;
                    local_428._12_4_ = uStack_48c;
                    local_428._0_12_ = auVar64;
                    args.valid = (int *)local_428;
                    pRVar108 = (RTCIntersectArguments *)pGVar109->userPtr;
                    args.hit = (RTCHitN *)&local_f8;
                    args.N = 4;
                    p_Var103 = pGVar109->intersectionFilterN;
                    args.geometryUserPtr = pRVar108;
                    args.ray = (RTCRayN *)ray;
                    if (p_Var103 != (RTCFilterFunctionN)0x0) {
                      p_Var103 = (RTCFilterFunctionN)(*p_Var103)(&args);
                    }
                    auVar208._0_4_ = -(uint)(local_428._0_4_ == 0);
                    auVar208._4_4_ = -(uint)(local_428._4_4_ == 0);
                    auVar208._8_4_ = -(uint)(local_428._8_4_ == 0);
                    auVar208._12_4_ = -(uint)(local_428._12_4_ == 0);
                    uVar115 = movmskps((int)p_Var103,auVar208);
                    pRVar104 = (RTCRayN *)(ulong)(uVar115 ^ 0xf);
                    if ((uVar115 ^ 0xf) == 0) {
                      auVar208 = auVar208 ^ _DAT_01f46b70;
                    }
                    else {
                      pRVar108 = context->args;
                      pRVar105 = (RTCIntersectArguments *)pRVar108->filter;
                      if ((pRVar105 != (RTCIntersectArguments *)0x0) &&
                         ((((ulong)*(Scene **)&pRVar108->flags & 2) != 0 ||
                          (((pGVar109->field_8).field_0x2 & 0x40) != 0)))) {
                        pRVar105 = (RTCIntersectArguments *)(*(code *)pRVar105)(&args);
                      }
                      auVar176._0_4_ = -(uint)(local_428._0_4_ == 0);
                      auVar176._4_4_ = -(uint)(local_428._4_4_ == 0);
                      auVar176._8_4_ = -(uint)(local_428._8_4_ == 0);
                      auVar176._12_4_ = -(uint)(local_428._12_4_ == 0);
                      auVar208 = auVar176 ^ _DAT_01f46b70;
                      uVar115 = movmskps((int)pRVar105,auVar176);
                      pRVar104 = (RTCRayN *)(ulong)(uVar115 ^ 0xf);
                      if ((uVar115 ^ 0xf) != 0) {
                        uVar115 = *(uint *)(args.hit + 4);
                        uVar117 = *(uint *)(args.hit + 8);
                        uVar116 = *(uint *)(args.hit + 0xc);
                        *(uint *)(args.ray + 0xc0) =
                             ~auVar176._0_4_ & *(uint *)args.hit |
                             *(uint *)(args.ray + 0xc0) & auVar176._0_4_;
                        *(uint *)(args.ray + 0xc4) =
                             ~auVar176._4_4_ & uVar115 | *(uint *)(args.ray + 0xc4) & auVar176._4_4_
                        ;
                        *(uint *)(args.ray + 200) =
                             ~auVar176._8_4_ & uVar117 | *(uint *)(args.ray + 200) & auVar176._8_4_;
                        *(uint *)(args.ray + 0xcc) =
                             ~auVar176._12_4_ & uVar116 |
                             *(uint *)(args.ray + 0xcc) & auVar176._12_4_;
                        uVar115 = *(uint *)(args.hit + 0x14);
                        uVar117 = *(uint *)(args.hit + 0x18);
                        uVar116 = *(uint *)(args.hit + 0x1c);
                        *(uint *)(args.ray + 0xd0) =
                             ~auVar176._0_4_ & *(uint *)(args.hit + 0x10) |
                             *(uint *)(args.ray + 0xd0) & auVar176._0_4_;
                        *(uint *)(args.ray + 0xd4) =
                             ~auVar176._4_4_ & uVar115 | *(uint *)(args.ray + 0xd4) & auVar176._4_4_
                        ;
                        *(uint *)(args.ray + 0xd8) =
                             ~auVar176._8_4_ & uVar117 | *(uint *)(args.ray + 0xd8) & auVar176._8_4_
                        ;
                        *(uint *)(args.ray + 0xdc) =
                             ~auVar176._12_4_ & uVar116 |
                             *(uint *)(args.ray + 0xdc) & auVar176._12_4_;
                        uVar115 = *(uint *)(args.hit + 0x24);
                        uVar117 = *(uint *)(args.hit + 0x28);
                        uVar116 = *(uint *)(args.hit + 0x2c);
                        *(uint *)(args.ray + 0xe0) =
                             ~auVar176._0_4_ & *(uint *)(args.hit + 0x20) |
                             *(uint *)(args.ray + 0xe0) & auVar176._0_4_;
                        *(uint *)(args.ray + 0xe4) =
                             ~auVar176._4_4_ & uVar115 | *(uint *)(args.ray + 0xe4) & auVar176._4_4_
                        ;
                        *(uint *)(args.ray + 0xe8) =
                             ~auVar176._8_4_ & uVar117 | *(uint *)(args.ray + 0xe8) & auVar176._8_4_
                        ;
                        *(uint *)(args.ray + 0xec) =
                             ~auVar176._12_4_ & uVar116 |
                             *(uint *)(args.ray + 0xec) & auVar176._12_4_;
                        uVar115 = *(uint *)(args.hit + 0x34);
                        uVar117 = *(uint *)(args.hit + 0x38);
                        uVar116 = *(uint *)(args.hit + 0x3c);
                        *(uint *)(args.ray + 0xf0) =
                             ~auVar176._0_4_ & *(uint *)(args.hit + 0x30) |
                             *(uint *)(args.ray + 0xf0) & auVar176._0_4_;
                        *(uint *)(args.ray + 0xf4) =
                             ~auVar176._4_4_ & uVar115 | *(uint *)(args.ray + 0xf4) & auVar176._4_4_
                        ;
                        *(uint *)(args.ray + 0xf8) =
                             ~auVar176._8_4_ & uVar117 | *(uint *)(args.ray + 0xf8) & auVar176._8_4_
                        ;
                        *(uint *)(args.ray + 0xfc) =
                             ~auVar176._12_4_ & uVar116 |
                             *(uint *)(args.ray + 0xfc) & auVar176._12_4_;
                        uVar115 = *(uint *)(args.hit + 0x44);
                        uVar117 = *(uint *)(args.hit + 0x48);
                        uVar116 = *(uint *)(args.hit + 0x4c);
                        *(uint *)(args.ray + 0x100) =
                             ~auVar176._0_4_ & *(uint *)(args.hit + 0x40) |
                             *(uint *)(args.ray + 0x100) & auVar176._0_4_;
                        *(uint *)(args.ray + 0x104) =
                             ~auVar176._4_4_ & uVar115 |
                             *(uint *)(args.ray + 0x104) & auVar176._4_4_;
                        *(uint *)(args.ray + 0x108) =
                             ~auVar176._8_4_ & uVar117 |
                             *(uint *)(args.ray + 0x108) & auVar176._8_4_;
                        *(uint *)(args.ray + 0x10c) =
                             ~auVar176._12_4_ & uVar116 |
                             *(uint *)(args.ray + 0x10c) & auVar176._12_4_;
                        uVar115 = *(uint *)(args.hit + 0x54);
                        uVar117 = *(uint *)(args.hit + 0x58);
                        uVar116 = *(uint *)(args.hit + 0x5c);
                        *(uint *)(args.ray + 0x110) =
                             *(uint *)(args.ray + 0x110) & auVar176._0_4_ |
                             ~auVar176._0_4_ & *(uint *)(args.hit + 0x50);
                        *(uint *)(args.ray + 0x114) =
                             *(uint *)(args.ray + 0x114) & auVar176._4_4_ |
                             ~auVar176._4_4_ & uVar115;
                        *(uint *)(args.ray + 0x118) =
                             *(uint *)(args.ray + 0x118) & auVar176._8_4_ |
                             ~auVar176._8_4_ & uVar117;
                        *(uint *)(args.ray + 0x11c) =
                             *(uint *)(args.ray + 0x11c) & auVar176._12_4_ |
                             ~auVar176._12_4_ & uVar116;
                        uVar115 = *(uint *)(args.hit + 100);
                        uVar117 = *(uint *)(args.hit + 0x68);
                        uVar116 = *(uint *)(args.hit + 0x6c);
                        *(uint *)(args.ray + 0x120) =
                             *(uint *)(args.ray + 0x120) & auVar176._0_4_ |
                             ~auVar176._0_4_ & *(uint *)(args.hit + 0x60);
                        *(uint *)(args.ray + 0x124) =
                             *(uint *)(args.ray + 0x124) & auVar176._4_4_ |
                             ~auVar176._4_4_ & uVar115;
                        *(uint *)(args.ray + 0x128) =
                             *(uint *)(args.ray + 0x128) & auVar176._8_4_ |
                             ~auVar176._8_4_ & uVar117;
                        *(uint *)(args.ray + 300) =
                             *(uint *)(args.ray + 300) & auVar176._12_4_ |
                             ~auVar176._12_4_ & uVar116;
                        uVar115 = *(uint *)(args.hit + 0x74);
                        uVar117 = *(uint *)(args.hit + 0x78);
                        uVar116 = *(uint *)(args.hit + 0x7c);
                        *(uint *)(args.ray + 0x130) =
                             ~auVar176._0_4_ & *(uint *)(args.hit + 0x70) |
                             *(uint *)(args.ray + 0x130) & auVar176._0_4_;
                        *(uint *)(args.ray + 0x134) =
                             ~auVar176._4_4_ & uVar115 |
                             *(uint *)(args.ray + 0x134) & auVar176._4_4_;
                        *(uint *)(args.ray + 0x138) =
                             ~auVar176._8_4_ & uVar117 |
                             *(uint *)(args.ray + 0x138) & auVar176._8_4_;
                        *(uint *)(args.ray + 0x13c) =
                             ~auVar176._12_4_ & uVar116 |
                             *(uint *)(args.ray + 0x13c) & auVar176._12_4_;
                        *(undefined1 (*) [16])(args.ray + 0x140) =
                             ~auVar176 & *(undefined1 (*) [16])(args.hit + 0x80) |
                             *(undefined1 (*) [16])(args.ray + 0x140) & auVar176;
                        pRVar104 = args.ray;
                        pRVar108 = (RTCIntersectArguments *)args.hit;
                      }
                    }
                    auVar209._0_4_ = auVar208._0_4_ << 0x1f;
                    auVar209._4_4_ = auVar208._4_4_ << 0x1f;
                    auVar209._8_4_ = auVar208._8_4_ << 0x1f;
                    auVar209._12_4_ = auVar208._12_4_ << 0x1f;
                    iVar181 = movmskps((int)pRVar104,auVar209);
                    if (iVar181 == 0) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_518._0_4_;
                    }
                    else {
                      local_518._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      register0x00001244 = 0.0;
                      fStack_510 = 0.0;
                      uStack_50c = 0;
                    }
                    *(undefined4 *)(local_428 + lVar112 * 4 + -0x10) = 0;
                    valid.field_0.i[0] =
                         -(uint)(local_388 <= (float)local_518._0_4_) & valid.field_0.i[0];
                    valid.field_0.i[1] =
                         -(uint)(fStack_384 <= (float)local_518._0_4_) & valid.field_0.i[1];
                    valid.field_0.i[2] =
                         -(uint)(fStack_380 <= (float)local_518._0_4_) & valid.field_0.i[2];
                    valid.field_0.i[3] =
                         -(uint)(fStack_37c <= (float)local_518._0_4_) & valid.field_0.i[3];
                    iVar181 = movmskps(iVar181,(undefined1  [16])valid.field_0);
                    if (iVar181 == 0) break;
                    auVar210._0_4_ = valid.field_0.i[0] & (uint)local_388;
                    auVar210._4_4_ = valid.field_0.i[1] & (uint)fStack_384;
                    auVar210._8_4_ = valid.field_0.i[2] & (uint)fStack_380;
                    auVar210._12_4_ = valid.field_0.i[3] & (uint)fStack_37c;
                    auVar237._0_8_ =
                         CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                    auVar237._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                    auVar237._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                    auVar237 = auVar237 | auVar210;
                    auVar259._4_4_ = auVar237._0_4_;
                    auVar259._0_4_ = auVar237._4_4_;
                    auVar259._8_4_ = auVar237._12_4_;
                    auVar259._12_4_ = auVar237._8_4_;
                    auVar144 = minps(auVar259,auVar237);
                    auVar211._0_8_ = auVar144._8_8_;
                    auVar211._8_4_ = auVar144._0_4_;
                    auVar211._12_4_ = auVar144._4_4_;
                    auVar144 = minps(auVar211,auVar144);
                    auVar212._0_8_ =
                         CONCAT44(-(uint)(auVar144._4_4_ == auVar237._4_4_) & valid.field_0.i[1],
                                  -(uint)(auVar144._0_4_ == auVar237._0_4_) & valid.field_0.i[0]);
                    auVar212._8_4_ = -(uint)(auVar144._8_4_ == auVar237._8_4_) & valid.field_0.i[2];
                    auVar212._12_4_ =
                         -(uint)(auVar144._12_4_ == auVar237._12_4_) & valid.field_0.i[3];
                    iVar181 = movmskps(iVar181,auVar212);
                    aVar177 = valid.field_0;
                    if (iVar181 != 0) {
                      aVar177.i[2] = auVar212._8_4_;
                      aVar177._0_8_ = auVar212._0_8_;
                      aVar177.i[3] = auVar212._12_4_;
                    }
                    uVar100 = movmskps(iVar181,(undefined1  [16])aVar177);
                    uVar106 = CONCAT44((int)((ulong)pRVar104 >> 0x20),uVar100);
                    lVar112 = 0;
                    if (uVar106 != 0) {
                      for (; (uVar106 >> lVar112 & 1) == 0; lVar112 = lVar112 + 1) {
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    fVar190 = *(float *)(ray + k * 4 + 0x80);
    auVar203._4_4_ = -(uint)(fStack_44 <= fVar190);
    auVar203._0_4_ = -(uint)(local_48 <= fVar190);
    auVar203._8_4_ = -(uint)(fStack_40 <= fVar190);
    auVar203._12_4_ = -(uint)(fStack_3c <= fVar190);
    uVar114 = movmskps(uVar100,auVar203);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }